

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx::CurveNiIntersectorK<4,8>::
     occluded_n<embree::avx::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  ulong uVar4;
  Primitive PVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  void *pvVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  bool bVar50;
  bool bVar51;
  bool bVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  bool bVar55;
  bool bVar56;
  bool bVar57;
  bool bVar58;
  bool bVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  bool bVar64;
  uint uVar65;
  ulong uVar66;
  long lVar67;
  uint uVar68;
  long lVar69;
  uint uVar71;
  ulong uVar72;
  ulong uVar73;
  bool bVar74;
  vint4 bi_1;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar77 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  float fVar87;
  float fVar110;
  vint4 bi_2;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar88;
  float fVar111;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  vint4 ai;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar128;
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  float fVar129;
  float fVar146;
  float fVar147;
  vint4 bi;
  undefined1 auVar130 [16];
  float fVar148;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  float fVar149;
  float fVar150;
  float fVar166;
  float fVar169;
  vint4 ai_2;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar171;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar167;
  float fVar170;
  float fVar172;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  float fVar168;
  float fVar173;
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  float fVar174;
  float fVar193;
  float fVar194;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar195;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar206;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar207;
  float fVar208;
  undefined1 auVar205 [32];
  vfloat4 b0;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  vint4 ai_1;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar247;
  float fVar248;
  undefined1 auVar246 [32];
  __m128 a;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [32];
  float fVar256;
  float fVar266;
  float fVar267;
  vfloat4 a0;
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  float fVar268;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  float fVar269;
  float fVar270;
  float fVar271;
  float fVar272;
  float fVar276;
  float fVar277;
  vfloat4 a0_1;
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  float fVar278;
  undefined1 auVar275 [16];
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar290 [16];
  undefined1 auVar289 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  float fVar294;
  float fVar295;
  undefined1 auVar293 [32];
  float fVar296;
  float fVar301;
  float fVar302;
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  vfloat_impl<4> p00;
  vfloat_impl<4> p01;
  vfloat_impl<4> p02;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_711;
  undefined1 local_6b0 [16];
  float local_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  undefined1 local_510 [8];
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  undefined1 local_4f0 [8];
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  undefined1 local_4d0 [8];
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  undefined1 local_4b0 [8];
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  uint auStack_490 [4];
  RTCFilterFunctionNArguments local_480;
  undefined1 local_450 [8];
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  undefined1 local_430 [8];
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [16];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  undefined1 local_330 [8];
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  float afStack_300 [8];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [16];
  undefined1 local_170 [16];
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar70;
  undefined1 auVar145 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [64];
  
  PVar5 = prim[1];
  uVar73 = (ulong)(byte)PVar5;
  fVar129 = *(float *)(prim + uVar73 * 0x19 + 0x12);
  auVar98 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar98 = vinsertps_avx(auVar98,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar199 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar199 = vinsertps_avx(auVar199,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar98 = vsubps_avx(auVar98,*(undefined1 (*) [16])(prim + uVar73 * 0x19 + 6));
  auVar89._0_4_ = fVar129 * auVar98._0_4_;
  auVar89._4_4_ = fVar129 * auVar98._4_4_;
  auVar89._8_4_ = fVar129 * auVar98._8_4_;
  auVar89._12_4_ = fVar129 * auVar98._12_4_;
  auVar175._0_4_ = fVar129 * auVar199._0_4_;
  auVar175._4_4_ = fVar129 * auVar199._4_4_;
  auVar175._8_4_ = fVar129 * auVar199._8_4_;
  auVar175._12_4_ = fVar129 * auVar199._12_4_;
  auVar98 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 4 + 6)));
  auVar199 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 5 + 6)));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar191 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 6 + 6)));
  auVar199 = vcvtdq2ps_avx(auVar199);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0xb + 6)));
  auVar191 = vcvtdq2ps_avx(auVar191);
  auVar260 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar5 * 0xc) + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar5 * 0xc + uVar73 + 6)));
  auVar260 = vcvtdq2ps_avx(auVar260);
  auVar13 = vcvtdq2ps_avx(auVar13);
  uVar66 = (ulong)(uint)((int)(uVar73 * 9) * 2);
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 + 6)));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar97 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 + uVar73 + 6)));
  auVar97 = vcvtdq2ps_avx(auVar97);
  uVar66 = (ulong)(uint)((int)(uVar73 * 5) << 2);
  auVar90 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 + 6)));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar78 = vshufps_avx(auVar175,auVar175,0);
  auVar117 = vshufps_avx(auVar175,auVar175,0x55);
  auVar112 = vshufps_avx(auVar175,auVar175,0xaa);
  fVar129 = auVar112._0_4_;
  fVar149 = auVar112._4_4_;
  fVar174 = auVar112._8_4_;
  fVar146 = auVar112._12_4_;
  fVar194 = auVar117._0_4_;
  fVar148 = auVar117._4_4_;
  fVar171 = auVar117._8_4_;
  fVar195 = auVar117._12_4_;
  fVar166 = auVar78._0_4_;
  fVar193 = auVar78._4_4_;
  fVar147 = auVar78._8_4_;
  fVar169 = auVar78._12_4_;
  auVar273._0_4_ = fVar166 * auVar98._0_4_ + fVar194 * auVar199._0_4_ + fVar129 * auVar191._0_4_;
  auVar273._4_4_ = fVar193 * auVar98._4_4_ + fVar148 * auVar199._4_4_ + fVar149 * auVar191._4_4_;
  auVar273._8_4_ = fVar147 * auVar98._8_4_ + fVar171 * auVar199._8_4_ + fVar174 * auVar191._8_4_;
  auVar273._12_4_ = fVar169 * auVar98._12_4_ + fVar195 * auVar199._12_4_ + fVar146 * auVar191._12_4_
  ;
  auVar286._0_4_ = fVar166 * auVar12._0_4_ + fVar194 * auVar260._0_4_ + auVar13._0_4_ * fVar129;
  auVar286._4_4_ = fVar193 * auVar12._4_4_ + fVar148 * auVar260._4_4_ + auVar13._4_4_ * fVar149;
  auVar286._8_4_ = fVar147 * auVar12._8_4_ + fVar171 * auVar260._8_4_ + auVar13._8_4_ * fVar174;
  auVar286._12_4_ = fVar169 * auVar12._12_4_ + fVar195 * auVar260._12_4_ + auVar13._12_4_ * fVar146;
  auVar176._0_4_ = fVar166 * auVar75._0_4_ + fVar194 * auVar97._0_4_ + auVar90._0_4_ * fVar129;
  auVar176._4_4_ = fVar193 * auVar75._4_4_ + fVar148 * auVar97._4_4_ + auVar90._4_4_ * fVar149;
  auVar176._8_4_ = fVar147 * auVar75._8_4_ + fVar171 * auVar97._8_4_ + auVar90._8_4_ * fVar174;
  auVar176._12_4_ = fVar169 * auVar75._12_4_ + fVar195 * auVar97._12_4_ + auVar90._12_4_ * fVar146;
  auVar78 = vshufps_avx(auVar89,auVar89,0);
  auVar117 = vshufps_avx(auVar89,auVar89,0x55);
  auVar112 = vshufps_avx(auVar89,auVar89,0xaa);
  fVar129 = auVar112._0_4_;
  fVar149 = auVar112._4_4_;
  fVar174 = auVar112._8_4_;
  fVar146 = auVar112._12_4_;
  fVar194 = auVar117._0_4_;
  fVar148 = auVar117._4_4_;
  fVar171 = auVar117._8_4_;
  fVar195 = auVar117._12_4_;
  fVar166 = auVar78._0_4_;
  fVar193 = auVar78._4_4_;
  fVar147 = auVar78._8_4_;
  fVar169 = auVar78._12_4_;
  auVar196._0_4_ = fVar166 * auVar98._0_4_ + fVar194 * auVar199._0_4_ + fVar129 * auVar191._0_4_;
  auVar196._4_4_ = fVar193 * auVar98._4_4_ + fVar148 * auVar199._4_4_ + fVar149 * auVar191._4_4_;
  auVar196._8_4_ = fVar147 * auVar98._8_4_ + fVar171 * auVar199._8_4_ + fVar174 * auVar191._8_4_;
  auVar196._12_4_ = fVar169 * auVar98._12_4_ + fVar195 * auVar199._12_4_ + fVar146 * auVar191._12_4_
  ;
  auVar78._0_4_ = fVar166 * auVar12._0_4_ + auVar13._0_4_ * fVar129 + fVar194 * auVar260._0_4_;
  auVar78._4_4_ = fVar193 * auVar12._4_4_ + auVar13._4_4_ * fVar149 + fVar148 * auVar260._4_4_;
  auVar78._8_4_ = fVar147 * auVar12._8_4_ + auVar13._8_4_ * fVar174 + fVar171 * auVar260._8_4_;
  auVar78._12_4_ = fVar169 * auVar12._12_4_ + auVar13._12_4_ * fVar146 + fVar195 * auVar260._12_4_;
  auVar303._8_4_ = 0x7fffffff;
  auVar303._0_8_ = 0x7fffffff7fffffff;
  auVar303._12_4_ = 0x7fffffff;
  auVar309 = ZEXT1664(auVar303);
  auVar98 = vandps_avx(auVar273,auVar303);
  auVar151._8_4_ = 0x219392ef;
  auVar151._0_8_ = 0x219392ef219392ef;
  auVar151._12_4_ = 0x219392ef;
  auVar98 = vcmpps_avx(auVar98,auVar151,1);
  auVar199 = vblendvps_avx(auVar273,auVar151,auVar98);
  auVar98 = vandps_avx(auVar286,auVar303);
  auVar98 = vcmpps_avx(auVar98,auVar151,1);
  auVar191 = vblendvps_avx(auVar286,auVar151,auVar98);
  auVar98 = vandps_avx(auVar303,auVar176);
  auVar98 = vcmpps_avx(auVar98,auVar151,1);
  auVar98 = vblendvps_avx(auVar176,auVar151,auVar98);
  auVar117._0_4_ = fVar166 * auVar75._0_4_ + fVar194 * auVar97._0_4_ + auVar90._0_4_ * fVar129;
  auVar117._4_4_ = fVar193 * auVar75._4_4_ + fVar148 * auVar97._4_4_ + auVar90._4_4_ * fVar149;
  auVar117._8_4_ = fVar147 * auVar75._8_4_ + fVar171 * auVar97._8_4_ + auVar90._8_4_ * fVar174;
  auVar117._12_4_ = fVar169 * auVar75._12_4_ + fVar195 * auVar97._12_4_ + auVar90._12_4_ * fVar146;
  auVar12 = vrcpps_avx(auVar199);
  fVar129 = auVar12._0_4_;
  auVar130._0_4_ = fVar129 * auVar199._0_4_;
  fVar146 = auVar12._4_4_;
  auVar130._4_4_ = fVar146 * auVar199._4_4_;
  fVar147 = auVar12._8_4_;
  auVar130._8_4_ = fVar147 * auVar199._8_4_;
  fVar148 = auVar12._12_4_;
  auVar130._12_4_ = fVar148 * auVar199._12_4_;
  auVar217._8_4_ = 0x3f800000;
  auVar217._0_8_ = &DAT_3f8000003f800000;
  auVar217._12_4_ = 0x3f800000;
  auVar199 = vsubps_avx(auVar217,auVar130);
  fVar129 = fVar129 + fVar129 * auVar199._0_4_;
  fVar146 = fVar146 + fVar146 * auVar199._4_4_;
  fVar147 = fVar147 + fVar147 * auVar199._8_4_;
  fVar148 = fVar148 + fVar148 * auVar199._12_4_;
  auVar199 = vrcpps_avx(auVar191);
  fVar149 = auVar199._0_4_;
  auVar152._0_4_ = fVar149 * auVar191._0_4_;
  fVar166 = auVar199._4_4_;
  auVar152._4_4_ = fVar166 * auVar191._4_4_;
  fVar169 = auVar199._8_4_;
  auVar152._8_4_ = fVar169 * auVar191._8_4_;
  fVar171 = auVar199._12_4_;
  auVar152._12_4_ = fVar171 * auVar191._12_4_;
  auVar199 = vsubps_avx(auVar217,auVar152);
  fVar149 = fVar149 + fVar149 * auVar199._0_4_;
  fVar166 = fVar166 + fVar166 * auVar199._4_4_;
  fVar169 = fVar169 + fVar169 * auVar199._8_4_;
  fVar171 = fVar171 + fVar171 * auVar199._12_4_;
  auVar199 = vrcpps_avx(auVar98);
  fVar174 = auVar199._0_4_;
  auVar177._0_4_ = fVar174 * auVar98._0_4_;
  fVar193 = auVar199._4_4_;
  auVar177._4_4_ = fVar193 * auVar98._4_4_;
  fVar194 = auVar199._8_4_;
  auVar177._8_4_ = fVar194 * auVar98._8_4_;
  fVar195 = auVar199._12_4_;
  auVar177._12_4_ = fVar195 * auVar98._12_4_;
  auVar199 = vsubps_avx(auVar217,auVar177);
  auVar98._8_8_ = 0;
  auVar98._0_8_ = *(ulong *)(prim + uVar73 * 7 + 6);
  auVar98 = vpmovsxwd_avx(auVar98);
  fVar174 = fVar174 + fVar174 * auVar199._0_4_;
  fVar193 = fVar193 + fVar193 * auVar199._4_4_;
  fVar194 = fVar194 + fVar194 * auVar199._8_4_;
  fVar195 = fVar195 + fVar195 * auVar199._12_4_;
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,auVar196);
  auVar112._0_4_ = fVar129 * auVar98._0_4_;
  auVar112._4_4_ = fVar146 * auVar98._4_4_;
  auVar112._8_4_ = fVar147 * auVar98._8_4_;
  auVar112._12_4_ = fVar148 * auVar98._12_4_;
  auVar199._8_8_ = 0;
  auVar199._0_8_ = *(ulong *)(prim + uVar73 * 9 + 6);
  auVar98 = vpmovsxwd_avx(auVar199);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,auVar196);
  auVar131._0_4_ = fVar129 * auVar98._0_4_;
  auVar131._4_4_ = fVar146 * auVar98._4_4_;
  auVar131._8_4_ = fVar147 * auVar98._8_4_;
  auVar131._12_4_ = fVar148 * auVar98._12_4_;
  auVar191._8_8_ = 0;
  auVar191._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + 6);
  auVar199 = vpmovsxwd_avx(auVar191);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + uVar73 * -2 + 6);
  auVar98 = vpmovsxwd_avx(auVar12);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,auVar78);
  auVar218._0_4_ = auVar98._0_4_ * fVar149;
  auVar218._4_4_ = auVar98._4_4_ * fVar166;
  auVar218._8_4_ = auVar98._8_4_ * fVar169;
  auVar218._12_4_ = auVar98._12_4_ * fVar171;
  auVar98 = vcvtdq2ps_avx(auVar199);
  auVar98 = vsubps_avx(auVar98,auVar78);
  auVar75._0_4_ = fVar149 * auVar98._0_4_;
  auVar75._4_4_ = fVar166 * auVar98._4_4_;
  auVar75._8_4_ = fVar169 * auVar98._8_4_;
  auVar75._12_4_ = fVar171 * auVar98._12_4_;
  auVar260._8_8_ = 0;
  auVar260._0_8_ = *(ulong *)(prim + uVar66 + uVar73 + 6);
  auVar98 = vpmovsxwd_avx(auVar260);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,auVar117);
  auVar153._0_4_ = auVar98._0_4_ * fVar174;
  auVar153._4_4_ = auVar98._4_4_ * fVar193;
  auVar153._8_4_ = auVar98._8_4_ * fVar194;
  auVar153._12_4_ = auVar98._12_4_ * fVar195;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar73 * 0x17 + 6);
  auVar98 = vpmovsxwd_avx(auVar13);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,auVar117);
  auVar90._0_4_ = auVar98._0_4_ * fVar174;
  auVar90._4_4_ = auVar98._4_4_ * fVar193;
  auVar90._8_4_ = auVar98._8_4_ * fVar194;
  auVar90._12_4_ = auVar98._12_4_ * fVar195;
  auVar98 = vpminsd_avx(auVar112,auVar131);
  auVar199 = vpminsd_avx(auVar218,auVar75);
  auVar98 = vmaxps_avx(auVar98,auVar199);
  auVar199 = vpminsd_avx(auVar153,auVar90);
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar232._4_4_ = uVar2;
  auVar232._0_4_ = uVar2;
  auVar232._8_4_ = uVar2;
  auVar232._12_4_ = uVar2;
  auVar199 = vmaxps_avx(auVar199,auVar232);
  auVar98 = vmaxps_avx(auVar98,auVar199);
  local_410._0_4_ = auVar98._0_4_ * 0.99999964;
  local_410._4_4_ = auVar98._4_4_ * 0.99999964;
  local_410._8_4_ = auVar98._8_4_ * 0.99999964;
  local_410._12_4_ = auVar98._12_4_ * 0.99999964;
  auVar98 = vpmaxsd_avx(auVar112,auVar131);
  auVar199 = vpmaxsd_avx(auVar218,auVar75);
  auVar98 = vminps_avx(auVar98,auVar199);
  auVar199 = vpmaxsd_avx(auVar153,auVar90);
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar113._4_4_ = uVar2;
  auVar113._0_4_ = uVar2;
  auVar113._8_4_ = uVar2;
  auVar113._12_4_ = uVar2;
  auVar199 = vminps_avx(auVar199,auVar113);
  auVar98 = vminps_avx(auVar98,auVar199);
  auVar97._0_4_ = auVar98._0_4_ * 1.0000004;
  auVar97._4_4_ = auVar98._4_4_ * 1.0000004;
  auVar97._8_4_ = auVar98._8_4_ * 1.0000004;
  auVar97._12_4_ = auVar98._12_4_ * 1.0000004;
  auVar98 = vpshufd_avx(ZEXT116((byte)PVar5),0);
  auVar199 = vpcmpgtd_avx(auVar98,_DAT_01ff0cf0);
  auVar98 = vcmpps_avx(local_410,auVar97,2);
  auVar98 = vandps_avx(auVar98,auVar199);
  uVar65 = vmovmskps_avx(auVar98);
  local_711 = uVar65 != 0;
  if (uVar65 == 0) {
    return local_711;
  }
  uVar65 = uVar65 & 0xff;
  auVar81._16_16_ = mm_lookupmask_ps._240_16_;
  auVar81._0_16_ = mm_lookupmask_ps._240_16_;
  local_320 = vblendps_avx(auVar81,ZEXT832(0) << 0x20,0x80);
  uVar71 = 1 << ((byte)k & 0x1f);
  uVar66 = (ulong)((uVar71 & 0xf) << 4);
  lVar69 = (long)((int)uVar71 >> 4) * 0x10;
LAB_00f152a7:
  uVar73 = (ulong)uVar65;
  lVar67 = 0;
  if (uVar73 != 0) {
    for (; (uVar65 >> lVar67 & 1) == 0; lVar67 = lVar67 + 1) {
    }
  }
  uVar65 = *(uint *)(prim + 2);
  pGVar6 = (context->scene->geometries).items[uVar65].ptr;
  uVar72 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar67 * 4 + 6));
  p_Var7 = pGVar6[1].intersectionFilterN;
  pvVar8 = pGVar6[2].userPtr;
  _Var9 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar1 = (float *)(_Var9 + uVar72 * (long)pvVar8);
  fVar129 = *pfVar1;
  fVar149 = pfVar1[1];
  fVar174 = pfVar1[2];
  fVar146 = pfVar1[3];
  pfVar1 = (float *)(_Var9 + (uVar72 + 1) * (long)pvVar8);
  fVar166 = *pfVar1;
  fVar193 = pfVar1[1];
  fVar147 = pfVar1[2];
  fVar169 = pfVar1[3];
  pfVar1 = (float *)(_Var9 + (uVar72 + 2) * (long)pvVar8);
  fVar194 = *pfVar1;
  fVar148 = pfVar1[1];
  fVar171 = pfVar1[2];
  fVar195 = pfVar1[3];
  pfVar1 = (float *)(_Var9 + (long)pvVar8 * (uVar72 + 3));
  fVar87 = *pfVar1;
  fVar88 = pfVar1[1];
  fVar110 = pfVar1[2];
  fVar111 = pfVar1[3];
  uVar73 = uVar73 - 1 & uVar73;
  lVar10 = *(long *)&pGVar6[1].time_range.upper;
  pfVar1 = (float *)(lVar10 + (long)p_Var7 * uVar72);
  fVar128 = *pfVar1;
  fVar247 = pfVar1[1];
  fVar248 = pfVar1[2];
  fVar256 = pfVar1[3];
  pfVar1 = (float *)(lVar10 + (long)p_Var7 * (uVar72 + 1));
  fVar150 = *pfVar1;
  fVar167 = pfVar1[1];
  fVar170 = pfVar1[2];
  fVar172 = pfVar1[3];
  pfVar1 = (float *)(lVar10 + (long)p_Var7 * (uVar72 + 2));
  fVar266 = *pfVar1;
  fVar168 = pfVar1[1];
  fVar267 = pfVar1[2];
  fVar173 = pfVar1[3];
  lVar11 = 0;
  if (uVar73 != 0) {
    for (; (uVar73 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
    }
  }
  pfVar1 = (float *)(lVar10 + (long)p_Var7 * (uVar72 + 3));
  fVar268 = *pfVar1;
  fVar269 = pfVar1[1];
  fVar270 = pfVar1[2];
  fVar271 = pfVar1[3];
  if (((uVar73 != 0) && (uVar72 = uVar73 - 1 & uVar73, uVar72 != 0)) && (lVar10 = 0, uVar72 != 0)) {
    for (; (uVar72 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
    }
  }
  auVar98 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar191 = vinsertps_avx(auVar98,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  local_640._0_4_ =
       fVar128 * 0.16666667 + fVar150 * 0.6666667 + fVar266 * 0.16666667 + fVar268 * 0.0;
  local_640._4_4_ =
       fVar247 * 0.16666667 + fVar167 * 0.6666667 + fVar168 * 0.16666667 + fVar269 * 0.0;
  fStack_638 = fVar248 * 0.16666667 + fVar170 * 0.6666667 + fVar267 * 0.16666667 + fVar270 * 0.0;
  fStack_634 = fVar256 * 0.16666667 + fVar172 * 0.6666667 + fVar173 * 0.16666667 + fVar271 * 0.0;
  auVar114._0_4_ = fVar266 * 0.5 + fVar268 * 0.0;
  auVar114._4_4_ = fVar168 * 0.5 + fVar269 * 0.0;
  auVar114._8_4_ = fVar267 * 0.5 + fVar270 * 0.0;
  auVar114._12_4_ = fVar173 * 0.5 + fVar271 * 0.0;
  auVar257._0_4_ = fVar150 * 0.0;
  auVar257._4_4_ = fVar167 * 0.0;
  auVar257._8_4_ = fVar170 * 0.0;
  auVar257._12_4_ = fVar172 * 0.0;
  auVar98 = vsubps_avx(auVar114,auVar257);
  auVar258._0_4_ = fVar128 * 0.5;
  auVar258._4_4_ = fVar247 * 0.5;
  auVar258._8_4_ = fVar248 * 0.5;
  auVar258._12_4_ = fVar256 * 0.5;
  auVar90 = vsubps_avx(auVar98,auVar258);
  auVar259._0_4_ = fVar129 * 0.16666667 + fVar166 * 0.6666667 + fVar194 * 0.16666667 + fVar87 * 0.0;
  auVar259._4_4_ = fVar149 * 0.16666667 + fVar193 * 0.6666667 + fVar148 * 0.16666667 + fVar88 * 0.0;
  auVar259._8_4_ = fVar174 * 0.16666667 + fVar147 * 0.6666667 + fVar171 * 0.16666667 + fVar110 * 0.0
  ;
  auVar259._12_4_ =
       fVar146 * 0.16666667 + fVar169 * 0.6666667 + fVar195 * 0.16666667 + fVar111 * 0.0;
  auVar274._0_4_ = fVar194 * 0.5 + fVar87 * 0.0;
  auVar274._4_4_ = fVar148 * 0.5 + fVar88 * 0.0;
  auVar274._8_4_ = fVar171 * 0.5 + fVar110 * 0.0;
  auVar274._12_4_ = fVar195 * 0.5 + fVar111 * 0.0;
  auVar287._0_4_ = fVar166 * 0.0;
  auVar287._4_4_ = fVar193 * 0.0;
  auVar287._8_4_ = fVar147 * 0.0;
  auVar287._12_4_ = fVar169 * 0.0;
  auVar98 = vsubps_avx(auVar274,auVar287);
  auVar288._0_4_ = fVar129 * 0.5;
  auVar288._4_4_ = fVar149 * 0.5;
  auVar288._8_4_ = fVar174 * 0.5;
  auVar288._12_4_ = fVar146 * 0.5;
  auVar260 = vsubps_avx(auVar98,auVar288);
  auVar297._0_4_ = fVar128 * 0.0;
  auVar297._4_4_ = fVar247 * 0.0;
  auVar297._8_4_ = fVar248 * 0.0;
  auVar297._12_4_ = fVar256 * 0.0;
  local_660._0_4_ =
       auVar297._0_4_ + fVar150 * 0.16666667 + fVar266 * 0.6666667 + fVar268 * 0.16666667;
  local_660._4_4_ =
       auVar297._4_4_ + fVar167 * 0.16666667 + fVar168 * 0.6666667 + fVar269 * 0.16666667;
  fStack_658 = auVar297._8_4_ + fVar170 * 0.16666667 + fVar267 * 0.6666667 + fVar270 * 0.16666667;
  fStack_654 = auVar297._12_4_ + fVar172 * 0.16666667 + fVar173 * 0.6666667 + fVar271 * 0.16666667;
  auVar233._0_4_ = fVar266 * 0.0 + fVar268 * 0.5;
  auVar233._4_4_ = fVar168 * 0.0 + fVar269 * 0.5;
  auVar233._8_4_ = fVar267 * 0.0 + fVar270 * 0.5;
  auVar233._12_4_ = fVar173 * 0.0 + fVar271 * 0.5;
  auVar154._0_4_ = fVar150 * 0.5;
  auVar154._4_4_ = fVar167 * 0.5;
  auVar154._8_4_ = fVar170 * 0.5;
  auVar154._12_4_ = fVar172 * 0.5;
  auVar98 = vsubps_avx(auVar233,auVar154);
  auVar78 = vsubps_avx(auVar98,auVar297);
  auVar197._0_4_ = fVar129 * 0.0;
  auVar197._4_4_ = fVar149 * 0.0;
  auVar197._8_4_ = fVar174 * 0.0;
  auVar197._12_4_ = fVar146 * 0.0;
  auVar234._0_4_ = fVar166 * 0.16666667 + fVar194 * 0.6666667 + fVar87 * 0.16666667 + auVar197._0_4_
  ;
  auVar234._4_4_ = fVar193 * 0.16666667 + fVar148 * 0.6666667 + fVar88 * 0.16666667 + auVar197._4_4_
  ;
  auVar234._8_4_ =
       fVar147 * 0.16666667 + fVar171 * 0.6666667 + fVar110 * 0.16666667 + auVar197._8_4_;
  auVar234._12_4_ =
       fVar169 * 0.16666667 + fVar195 * 0.6666667 + fVar111 * 0.16666667 + auVar197._12_4_;
  auVar209._0_4_ = fVar87 * 0.5 + fVar194 * 0.0;
  auVar209._4_4_ = fVar88 * 0.5 + fVar148 * 0.0;
  auVar209._8_4_ = fVar110 * 0.5 + fVar171 * 0.0;
  auVar209._12_4_ = fVar111 * 0.5 + fVar195 * 0.0;
  auVar178._0_4_ = fVar166 * 0.5;
  auVar178._4_4_ = fVar193 * 0.5;
  auVar178._8_4_ = fVar147 * 0.5;
  auVar178._12_4_ = fVar169 * 0.5;
  auVar98 = vsubps_avx(auVar209,auVar178);
  auVar75 = vsubps_avx(auVar98,auVar197);
  auVar98 = vshufps_avx(auVar90,auVar90,0xc9);
  auVar199 = vshufps_avx(auVar259,auVar259,0xc9);
  fVar128 = auVar90._0_4_;
  auVar210._0_4_ = fVar128 * auVar199._0_4_;
  fVar247 = auVar90._4_4_;
  auVar210._4_4_ = fVar247 * auVar199._4_4_;
  fVar248 = auVar90._8_4_;
  auVar210._8_4_ = fVar248 * auVar199._8_4_;
  fVar256 = auVar90._12_4_;
  auVar210._12_4_ = fVar256 * auVar199._12_4_;
  auVar219._0_4_ = auVar259._0_4_ * auVar98._0_4_;
  auVar219._4_4_ = auVar259._4_4_ * auVar98._4_4_;
  auVar219._8_4_ = auVar259._8_4_ * auVar98._8_4_;
  auVar219._12_4_ = auVar259._12_4_ * auVar98._12_4_;
  auVar199 = vsubps_avx(auVar219,auVar210);
  auVar12 = vshufps_avx(auVar199,auVar199,0xc9);
  auVar199 = vshufps_avx(auVar260,auVar260,0xc9);
  auVar211._0_4_ = fVar128 * auVar199._0_4_;
  auVar211._4_4_ = fVar247 * auVar199._4_4_;
  auVar211._8_4_ = fVar248 * auVar199._8_4_;
  auVar211._12_4_ = fVar256 * auVar199._12_4_;
  auVar179._0_4_ = auVar260._0_4_ * auVar98._0_4_;
  auVar179._4_4_ = auVar260._4_4_ * auVar98._4_4_;
  auVar179._8_4_ = auVar260._8_4_ * auVar98._8_4_;
  auVar179._12_4_ = auVar260._12_4_ * auVar98._12_4_;
  auVar98 = vsubps_avx(auVar179,auVar211);
  auVar260 = vshufps_avx(auVar98,auVar98,0xc9);
  auVar199 = vshufps_avx(auVar78,auVar78,0xc9);
  auVar98 = vshufps_avx(auVar234,auVar234,0xc9);
  fVar150 = auVar78._0_4_;
  auVar180._0_4_ = fVar150 * auVar98._0_4_;
  fVar167 = auVar78._4_4_;
  auVar180._4_4_ = fVar167 * auVar98._4_4_;
  fVar170 = auVar78._8_4_;
  auVar180._8_4_ = fVar170 * auVar98._8_4_;
  fVar172 = auVar78._12_4_;
  auVar180._12_4_ = fVar172 * auVar98._12_4_;
  auVar235._0_4_ = auVar234._0_4_ * auVar199._0_4_;
  auVar235._4_4_ = auVar234._4_4_ * auVar199._4_4_;
  auVar235._8_4_ = auVar234._8_4_ * auVar199._8_4_;
  auVar235._12_4_ = auVar234._12_4_ * auVar199._12_4_;
  auVar98 = vsubps_avx(auVar235,auVar180);
  auVar13 = vshufps_avx(auVar98,auVar98,0xc9);
  auVar98 = vshufps_avx(auVar75,auVar75,0xc9);
  auVar236._0_4_ = auVar98._0_4_ * fVar150;
  auVar236._4_4_ = auVar98._4_4_ * fVar167;
  auVar236._8_4_ = auVar98._8_4_ * fVar170;
  auVar236._12_4_ = auVar98._12_4_ * fVar172;
  auVar98 = vdpps_avx(auVar12,auVar12,0x7f);
  auVar198._0_4_ = auVar199._0_4_ * auVar75._0_4_;
  auVar198._4_4_ = auVar199._4_4_ * auVar75._4_4_;
  auVar198._8_4_ = auVar199._8_4_ * auVar75._8_4_;
  auVar198._12_4_ = auVar199._12_4_ * auVar75._12_4_;
  auVar199 = vsubps_avx(auVar198,auVar236);
  auVar75 = vshufps_avx(auVar199,auVar199,0xc9);
  fVar166 = auVar98._0_4_;
  auVar112 = ZEXT416((uint)fVar166);
  auVar199 = vrsqrtss_avx(auVar112,auVar112);
  fVar129 = auVar199._0_4_;
  auVar199 = ZEXT416((uint)(fVar129 * 1.5 - fVar166 * 0.5 * fVar129 * fVar129 * fVar129));
  auVar97 = vshufps_avx(auVar199,auVar199,0);
  auVar199 = vdpps_avx(auVar12,auVar260,0x7f);
  fVar129 = auVar12._0_4_ * auVar97._0_4_;
  fVar149 = auVar12._4_4_ * auVar97._4_4_;
  fVar174 = auVar12._8_4_ * auVar97._8_4_;
  fVar146 = auVar12._12_4_ * auVar97._12_4_;
  auVar98 = vshufps_avx(auVar98,auVar98,0);
  auVar249._0_4_ = auVar260._0_4_ * auVar98._0_4_;
  auVar249._4_4_ = auVar260._4_4_ * auVar98._4_4_;
  auVar249._8_4_ = auVar260._8_4_ * auVar98._8_4_;
  auVar249._12_4_ = auVar260._12_4_ * auVar98._12_4_;
  auVar98 = vshufps_avx(auVar199,auVar199,0);
  auVar220._0_4_ = auVar12._0_4_ * auVar98._0_4_;
  auVar220._4_4_ = auVar12._4_4_ * auVar98._4_4_;
  auVar220._8_4_ = auVar12._8_4_ * auVar98._8_4_;
  auVar220._12_4_ = auVar12._12_4_ * auVar98._12_4_;
  auVar117 = vsubps_avx(auVar249,auVar220);
  auVar98 = vrcpss_avx(auVar112,auVar112);
  auVar98 = ZEXT416((uint)(auVar98._0_4_ * (2.0 - fVar166 * auVar98._0_4_)));
  auVar12 = vshufps_avx(auVar98,auVar98,0);
  auVar98 = vdpps_avx(auVar13,auVar13,0x7f);
  fVar166 = auVar98._0_4_;
  auVar112 = ZEXT416((uint)fVar166);
  auVar199 = vrsqrtss_avx(auVar112,auVar112);
  fVar193 = auVar199._0_4_;
  auVar199 = vdpps_avx(auVar13,auVar75,0x7f);
  auVar260 = ZEXT416((uint)(fVar193 * 1.5 - fVar166 * 0.5 * fVar193 * fVar193 * fVar193));
  auVar260 = vshufps_avx(auVar260,auVar260,0);
  fVar193 = auVar260._0_4_ * auVar13._0_4_;
  fVar147 = auVar260._4_4_ * auVar13._4_4_;
  fVar169 = auVar260._8_4_ * auVar13._8_4_;
  fVar194 = auVar260._12_4_ * auVar13._12_4_;
  auVar98 = vshufps_avx(auVar98,auVar98,0);
  auVar212._0_4_ = auVar98._0_4_ * auVar75._0_4_;
  auVar212._4_4_ = auVar98._4_4_ * auVar75._4_4_;
  auVar212._8_4_ = auVar98._8_4_ * auVar75._8_4_;
  auVar212._12_4_ = auVar98._12_4_ * auVar75._12_4_;
  auVar98 = vshufps_avx(auVar199,auVar199,0);
  auVar181._0_4_ = auVar98._0_4_ * auVar13._0_4_;
  auVar181._4_4_ = auVar98._4_4_ * auVar13._4_4_;
  auVar181._8_4_ = auVar98._8_4_ * auVar13._8_4_;
  auVar181._12_4_ = auVar98._12_4_ * auVar13._12_4_;
  auVar75 = vsubps_avx(auVar212,auVar181);
  auVar98 = vrcpss_avx(auVar112,auVar112);
  auVar98 = ZEXT416((uint)((2.0 - fVar166 * auVar98._0_4_) * auVar98._0_4_));
  auVar98 = vshufps_avx(auVar98,auVar98,0);
  auVar199 = vshufps_avx(_local_640,_local_640,0xff);
  auVar237._0_4_ = auVar199._0_4_ * fVar129;
  auVar237._4_4_ = auVar199._4_4_ * fVar149;
  auVar237._8_4_ = auVar199._8_4_ * fVar174;
  auVar237._12_4_ = auVar199._12_4_ * fVar146;
  _local_4b0 = vsubps_avx(_local_640,auVar237);
  auVar13 = vshufps_avx(auVar90,auVar90,0xff);
  auVar200._0_4_ =
       auVar13._0_4_ * fVar129 + auVar97._0_4_ * auVar117._0_4_ * auVar12._0_4_ * auVar199._0_4_;
  auVar200._4_4_ =
       auVar13._4_4_ * fVar149 + auVar97._4_4_ * auVar117._4_4_ * auVar12._4_4_ * auVar199._4_4_;
  auVar200._8_4_ =
       auVar13._8_4_ * fVar174 + auVar97._8_4_ * auVar117._8_4_ * auVar12._8_4_ * auVar199._8_4_;
  auVar200._12_4_ =
       auVar13._12_4_ * fVar146 +
       auVar97._12_4_ * auVar117._12_4_ * auVar12._12_4_ * auVar199._12_4_;
  auVar13 = vsubps_avx(auVar90,auVar200);
  local_4c0._0_4_ = auVar237._0_4_ + (float)local_640._0_4_;
  local_4c0._4_4_ = auVar237._4_4_ + (float)local_640._4_4_;
  fStack_4b8 = auVar237._8_4_ + fStack_638;
  fStack_4b4 = auVar237._12_4_ + fStack_634;
  auVar199 = vshufps_avx(_local_660,_local_660,0xff);
  auVar115._0_4_ = fVar193 * auVar199._0_4_;
  auVar115._4_4_ = fVar147 * auVar199._4_4_;
  auVar115._8_4_ = fVar169 * auVar199._8_4_;
  auVar115._12_4_ = fVar194 * auVar199._12_4_;
  _local_4d0 = vsubps_avx(_local_660,auVar115);
  auVar12 = vshufps_avx(auVar78,auVar78,0xff);
  auVar91._0_4_ =
       fVar193 * auVar12._0_4_ + auVar199._0_4_ * auVar260._0_4_ * auVar75._0_4_ * auVar98._0_4_;
  auVar91._4_4_ =
       fVar147 * auVar12._4_4_ + auVar199._4_4_ * auVar260._4_4_ * auVar75._4_4_ * auVar98._4_4_;
  auVar91._8_4_ =
       fVar169 * auVar12._8_4_ + auVar199._8_4_ * auVar260._8_4_ * auVar75._8_4_ * auVar98._8_4_;
  auVar91._12_4_ =
       fVar194 * auVar12._12_4_ +
       auVar199._12_4_ * auVar260._12_4_ * auVar75._12_4_ * auVar98._12_4_;
  auVar260 = vsubps_avx(auVar78,auVar91);
  local_4e0._0_4_ = (float)local_660._0_4_ + auVar115._0_4_;
  local_4e0._4_4_ = (float)local_660._4_4_ + auVar115._4_4_;
  fStack_4d8 = fStack_658 + auVar115._8_4_;
  fStack_4d4 = fStack_654 + auVar115._12_4_;
  local_4f0._0_4_ = local_4b0._0_4_ + auVar13._0_4_ * 0.33333334;
  local_4f0._4_4_ = local_4b0._4_4_ + auVar13._4_4_ * 0.33333334;
  fStack_4e8 = local_4b0._8_4_ + auVar13._8_4_ * 0.33333334;
  fStack_4e4 = local_4b0._12_4_ + auVar13._12_4_ * 0.33333334;
  local_380 = vsubps_avx(_local_4b0,auVar191);
  auVar199 = vmovsldup_avx(local_380);
  auVar98 = vmovshdup_avx(local_380);
  auVar12 = vshufps_avx(local_380,local_380,0xaa);
  fVar129 = pre->ray_space[k].vx.field_0.m128[0];
  fVar149 = pre->ray_space[k].vx.field_0.m128[1];
  fVar174 = pre->ray_space[k].vx.field_0.m128[2];
  fVar146 = pre->ray_space[k].vx.field_0.m128[3];
  fVar166 = pre->ray_space[k].vy.field_0.m128[0];
  fVar193 = pre->ray_space[k].vy.field_0.m128[1];
  fVar147 = pre->ray_space[k].vy.field_0.m128[2];
  fVar169 = pre->ray_space[k].vy.field_0.m128[3];
  fVar194 = pre->ray_space[k].vz.field_0.m128[0];
  fVar148 = pre->ray_space[k].vz.field_0.m128[1];
  fVar171 = pre->ray_space[k].vz.field_0.m128[2];
  fVar195 = pre->ray_space[k].vz.field_0.m128[3];
  fVar87 = fVar129 * auVar199._0_4_ + auVar12._0_4_ * fVar194 + fVar166 * auVar98._0_4_;
  fVar110 = fVar149 * auVar199._4_4_ + auVar12._4_4_ * fVar148 + fVar193 * auVar98._4_4_;
  local_640._4_4_ = fVar110;
  local_640._0_4_ = fVar87;
  fStack_638 = fVar174 * auVar199._8_4_ + auVar12._8_4_ * fVar171 + fVar147 * auVar98._8_4_;
  fStack_634 = fVar146 * auVar199._12_4_ + auVar12._12_4_ * fVar195 + fVar169 * auVar98._12_4_;
  local_390 = vsubps_avx(_local_4f0,auVar191);
  auVar12 = vshufps_avx(local_390,local_390,0xaa);
  auVar98 = vmovshdup_avx(local_390);
  auVar199 = vmovsldup_avx(local_390);
  fVar88 = auVar199._0_4_ * fVar129 + auVar98._0_4_ * fVar166 + fVar194 * auVar12._0_4_;
  fVar111 = auVar199._4_4_ * fVar149 + auVar98._4_4_ * fVar193 + fVar148 * auVar12._4_4_;
  local_620._4_4_ = fVar111;
  local_620._0_4_ = fVar88;
  fStack_618 = auVar199._8_4_ * fVar174 + auVar98._8_4_ * fVar147 + fVar171 * auVar12._8_4_;
  fStack_614 = auVar199._12_4_ * fVar146 + auVar98._12_4_ * fVar169 + fVar195 * auVar12._12_4_;
  auVar182._0_4_ = auVar260._0_4_ * 0.33333334;
  auVar182._4_4_ = auVar260._4_4_ * 0.33333334;
  auVar182._8_4_ = auVar260._8_4_ * 0.33333334;
  auVar182._12_4_ = auVar260._12_4_ * 0.33333334;
  _local_500 = vsubps_avx(_local_4d0,auVar182);
  local_3a0 = vsubps_avx(_local_500,auVar191);
  auVar12 = vshufps_avx(local_3a0,local_3a0,0xaa);
  auVar98 = vmovshdup_avx(local_3a0);
  auVar199 = vmovsldup_avx(local_3a0);
  auVar298._0_4_ = auVar199._0_4_ * fVar129 + auVar98._0_4_ * fVar166 + fVar194 * auVar12._0_4_;
  auVar298._4_4_ = auVar199._4_4_ * fVar149 + auVar98._4_4_ * fVar193 + fVar148 * auVar12._4_4_;
  auVar298._8_4_ = auVar199._8_4_ * fVar174 + auVar98._8_4_ * fVar147 + fVar171 * auVar12._8_4_;
  auVar298._12_4_ = auVar199._12_4_ * fVar146 + auVar98._12_4_ * fVar169 + fVar195 * auVar12._12_4_;
  local_3b0 = vsubps_avx(_local_4d0,auVar191);
  auVar12 = vshufps_avx(local_3b0,local_3b0,0xaa);
  auVar98 = vmovshdup_avx(local_3b0);
  auVar199 = vmovsldup_avx(local_3b0);
  auVar289._0_8_ =
       CONCAT44(auVar199._4_4_ * fVar149 + auVar98._4_4_ * fVar193 + auVar12._4_4_ * fVar148,
                auVar199._0_4_ * fVar129 + auVar98._0_4_ * fVar166 + auVar12._0_4_ * fVar194);
  auVar289._8_4_ = auVar199._8_4_ * fVar174 + auVar98._8_4_ * fVar147 + auVar12._8_4_ * fVar171;
  auVar289._12_4_ = auVar199._12_4_ * fVar146 + auVar98._12_4_ * fVar169 + auVar12._12_4_ * fVar195;
  local_3c0 = vsubps_avx(_local_4c0,auVar191);
  auVar12 = vshufps_avx(local_3c0,local_3c0,0xaa);
  auVar98 = vmovshdup_avx(local_3c0);
  auVar199 = vmovsldup_avx(local_3c0);
  auVar250._0_4_ = auVar199._0_4_ * fVar129 + auVar98._0_4_ * fVar166 + auVar12._0_4_ * fVar194;
  auVar250._4_4_ = auVar199._4_4_ * fVar149 + auVar98._4_4_ * fVar193 + auVar12._4_4_ * fVar148;
  auVar250._8_4_ = auVar199._8_4_ * fVar174 + auVar98._8_4_ * fVar147 + auVar12._8_4_ * fVar171;
  auVar250._12_4_ = auVar199._12_4_ * fVar146 + auVar98._12_4_ * fVar169 + auVar12._12_4_ * fVar195;
  local_510._0_4_ = (fVar128 + auVar200._0_4_) * 0.33333334 + (float)local_4c0._0_4_;
  local_510._4_4_ = (fVar247 + auVar200._4_4_) * 0.33333334 + (float)local_4c0._4_4_;
  fStack_508 = (fVar248 + auVar200._8_4_) * 0.33333334 + fStack_4b8;
  fStack_504 = (fVar256 + auVar200._12_4_) * 0.33333334 + fStack_4b4;
  local_3d0 = vsubps_avx(_local_510,auVar191);
  auVar12 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar98 = vmovshdup_avx(local_3d0);
  auVar199 = vmovsldup_avx(local_3d0);
  auVar221._0_4_ = auVar199._0_4_ * fVar129 + auVar98._0_4_ * fVar166 + auVar12._0_4_ * fVar194;
  auVar221._4_4_ = auVar199._4_4_ * fVar149 + auVar98._4_4_ * fVar193 + auVar12._4_4_ * fVar148;
  auVar221._8_4_ = auVar199._8_4_ * fVar174 + auVar98._8_4_ * fVar147 + auVar12._8_4_ * fVar171;
  auVar221._12_4_ = auVar199._12_4_ * fVar146 + auVar98._12_4_ * fVar169 + auVar12._12_4_ * fVar195;
  auVar213._0_4_ = (fVar150 + auVar91._0_4_) * 0.33333334;
  auVar213._4_4_ = (fVar167 + auVar91._4_4_) * 0.33333334;
  auVar213._8_4_ = (fVar170 + auVar91._8_4_) * 0.33333334;
  auVar213._12_4_ = (fVar172 + auVar91._12_4_) * 0.33333334;
  _local_520 = vsubps_avx(_local_4e0,auVar213);
  local_3e0 = vsubps_avx(_local_520,auVar191);
  auVar12 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar98 = vmovshdup_avx(local_3e0);
  auVar199 = vmovsldup_avx(local_3e0);
  auVar92._0_4_ = auVar199._0_4_ * fVar129 + auVar98._0_4_ * fVar166 + fVar194 * auVar12._0_4_;
  auVar92._4_4_ = auVar199._4_4_ * fVar149 + auVar98._4_4_ * fVar193 + fVar148 * auVar12._4_4_;
  auVar92._8_4_ = auVar199._8_4_ * fVar174 + auVar98._8_4_ * fVar147 + fVar171 * auVar12._8_4_;
  auVar92._12_4_ = auVar199._12_4_ * fVar146 + auVar98._12_4_ * fVar169 + fVar195 * auVar12._12_4_;
  local_3f0 = vsubps_avx(_local_4e0,auVar191);
  auVar191 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar98 = vmovshdup_avx(local_3f0);
  auVar199 = vmovsldup_avx(local_3f0);
  auVar76._0_4_ = fVar129 * auVar199._0_4_ + fVar166 * auVar98._0_4_ + fVar194 * auVar191._0_4_;
  auVar76._4_4_ = fVar149 * auVar199._4_4_ + fVar193 * auVar98._4_4_ + fVar148 * auVar191._4_4_;
  auVar76._8_4_ = fVar174 * auVar199._8_4_ + fVar147 * auVar98._8_4_ + fVar171 * auVar191._8_4_;
  auVar76._12_4_ = fVar146 * auVar199._12_4_ + fVar169 * auVar98._12_4_ + fVar195 * auVar191._12_4_;
  auVar12 = vmovlhps_avx(_local_640,auVar250);
  auVar260 = vmovlhps_avx(_local_620,auVar221);
  auVar13 = vmovlhps_avx(auVar298,auVar92);
  _local_360 = vmovlhps_avx(auVar289,auVar76);
  auVar98 = vminps_avx(auVar12,auVar260);
  auVar199 = vminps_avx(auVar13,_local_360);
  auVar191 = vminps_avx(auVar98,auVar199);
  auVar98 = vmaxps_avx(auVar12,auVar260);
  auVar199 = vmaxps_avx(auVar13,_local_360);
  auVar98 = vmaxps_avx(auVar98,auVar199);
  auVar199 = vshufpd_avx(auVar191,auVar191,3);
  auVar191 = vminps_avx(auVar191,auVar199);
  auVar199 = vshufpd_avx(auVar98,auVar98,3);
  auVar199 = vmaxps_avx(auVar98,auVar199);
  auVar98 = vandps_avx(auVar309._0_16_,auVar191);
  auVar199 = vandps_avx(auVar309._0_16_,auVar199);
  auVar98 = vmaxps_avx(auVar98,auVar199);
  auVar199 = vmovshdup_avx(auVar98);
  auVar98 = vmaxss_avx(auVar199,auVar98);
  fVar129 = auVar98._0_4_ * 9.536743e-07;
  register0x00001548 = auVar289._0_8_;
  local_4a0 = auVar289._0_8_;
  local_370 = ZEXT416((uint)fVar129);
  auVar98 = vshufps_avx(ZEXT416((uint)fVar129),ZEXT416((uint)fVar129),0);
  local_280._16_16_ = auVar98;
  local_280._0_16_ = auVar98;
  auVar77._0_8_ = auVar98._0_8_ ^ 0x8000000080000000;
  auVar77._8_4_ = auVar98._8_4_ ^ 0x80000000;
  auVar77._12_4_ = auVar98._12_4_ ^ 0x80000000;
  local_2a0._16_16_ = auVar77;
  local_2a0._0_16_ = auVar77;
  auVar98 = vshufps_avx(ZEXT416(uVar65),ZEXT416(uVar65),0);
  local_2c0._16_16_ = auVar98;
  local_2c0._0_16_ = auVar98;
  auVar98 = vpshufd_avx(ZEXT416(*(uint *)(prim + lVar67 * 4 + 6)),0);
  local_2e0._16_16_ = auVar98;
  local_2e0._0_16_ = auVar98;
  bVar64 = false;
  uVar72 = 0;
  fVar129 = *(float *)(ray + k * 4 + 0x60);
  _local_330 = vsubps_avx(auVar260,auVar12);
  _local_340 = vsubps_avx(auVar13,auVar260);
  _local_350 = vsubps_avx(_local_360,auVar13);
  _local_420 = vsubps_avx(_local_4c0,_local_4b0);
  _local_430 = vsubps_avx(_local_510,_local_4f0);
  _local_440 = vsubps_avx(_local_520,_local_500);
  _local_450 = vsubps_avx(_local_4e0,_local_4d0);
  local_6b0 = ZEXT816(0x3f80000000000000);
  local_400 = local_6b0;
  do {
    auVar98 = vshufps_avx(local_6b0,local_6b0,0x50);
    auVar304._8_4_ = 0x3f800000;
    auVar304._0_8_ = &DAT_3f8000003f800000;
    auVar304._12_4_ = 0x3f800000;
    auVar308._16_4_ = 0x3f800000;
    auVar308._0_16_ = auVar304;
    auVar308._20_4_ = 0x3f800000;
    auVar308._24_4_ = 0x3f800000;
    auVar308._28_4_ = 0x3f800000;
    auVar199 = vsubps_avx(auVar304,auVar98);
    fVar149 = auVar98._0_4_;
    fVar146 = auVar98._4_4_;
    fVar193 = auVar98._8_4_;
    fVar169 = auVar98._12_4_;
    fVar174 = auVar199._0_4_;
    fVar166 = auVar199._4_4_;
    fVar147 = auVar199._8_4_;
    fVar194 = auVar199._12_4_;
    auVar116._0_4_ = auVar250._0_4_ * fVar149 + fVar87 * fVar174;
    auVar116._4_4_ = auVar250._4_4_ * fVar146 + fVar110 * fVar166;
    auVar116._8_4_ = auVar250._0_4_ * fVar193 + fVar87 * fVar147;
    auVar116._12_4_ = auVar250._4_4_ * fVar169 + fVar110 * fVar194;
    auVar93._0_4_ = auVar221._0_4_ * fVar149 + fVar88 * fVar174;
    auVar93._4_4_ = auVar221._4_4_ * fVar146 + fVar111 * fVar166;
    auVar93._8_4_ = auVar221._0_4_ * fVar193 + fVar88 * fVar147;
    auVar93._12_4_ = auVar221._4_4_ * fVar169 + fVar111 * fVar194;
    auVar155._0_4_ = auVar92._0_4_ * fVar149 + auVar298._0_4_ * fVar174;
    auVar155._4_4_ = auVar92._4_4_ * fVar146 + auVar298._4_4_ * fVar166;
    auVar155._8_4_ = auVar92._0_4_ * fVar193 + auVar298._0_4_ * fVar147;
    auVar155._12_4_ = auVar92._4_4_ * fVar169 + auVar298._4_4_ * fVar194;
    auVar132._0_4_ = auVar76._0_4_ * fVar149 + local_4a0._0_4_ * fVar174;
    auVar132._4_4_ = auVar76._4_4_ * fVar146 + local_4a0._4_4_ * fVar166;
    auVar132._8_4_ = auVar76._0_4_ * fVar193 + local_4a0._8_4_ * fVar147;
    auVar132._12_4_ = auVar76._4_4_ * fVar169 + local_4a0._12_4_ * fVar194;
    auVar98 = vmovshdup_avx(local_400);
    auVar199 = vshufps_avx(local_400,local_400,0);
    auVar230._16_16_ = auVar199;
    auVar230._0_16_ = auVar199;
    auVar191 = vshufps_avx(local_400,local_400,0x55);
    auVar82._16_16_ = auVar191;
    auVar82._0_16_ = auVar191;
    auVar81 = vsubps_avx(auVar82,auVar230);
    auVar191 = vshufps_avx(auVar116,auVar116,0);
    auVar75 = vshufps_avx(auVar116,auVar116,0x55);
    auVar97 = vshufps_avx(auVar93,auVar93,0);
    auVar90 = vshufps_avx(auVar93,auVar93,0x55);
    auVar78 = vshufps_avx(auVar155,auVar155,0);
    auVar117 = vshufps_avx(auVar155,auVar155,0x55);
    auVar112 = vshufps_avx(auVar132,auVar132,0);
    auVar89 = vshufps_avx(auVar132,auVar132,0x55);
    auVar98 = ZEXT416((uint)((auVar98._0_4_ - local_400._0_4_) * 0.04761905));
    auVar98 = vshufps_avx(auVar98,auVar98,0);
    auVar246._0_4_ = auVar199._0_4_ + auVar81._0_4_ * 0.0;
    auVar246._4_4_ = auVar199._4_4_ + auVar81._4_4_ * 0.14285715;
    auVar246._8_4_ = auVar199._8_4_ + auVar81._8_4_ * 0.2857143;
    auVar246._12_4_ = auVar199._12_4_ + auVar81._12_4_ * 0.42857146;
    auVar246._16_4_ = auVar199._0_4_ + auVar81._16_4_ * 0.5714286;
    auVar246._20_4_ = auVar199._4_4_ + auVar81._20_4_ * 0.71428573;
    auVar246._24_4_ = auVar199._8_4_ + auVar81._24_4_ * 0.8571429;
    auVar246._28_4_ = auVar199._12_4_ + auVar81._28_4_;
    auVar16 = vsubps_avx(auVar308,auVar246);
    fVar248 = auVar97._0_4_;
    fVar150 = auVar97._4_4_;
    fVar168 = auVar97._8_4_;
    fVar173 = auVar97._12_4_;
    fVar149 = auVar16._0_4_;
    fVar193 = auVar16._4_4_;
    fVar148 = auVar16._8_4_;
    fVar247 = auVar16._12_4_;
    fVar294 = auVar191._12_4_;
    fVar167 = auVar16._16_4_;
    fVar170 = auVar16._20_4_;
    fVar172 = auVar16._24_4_;
    fVar206 = auVar90._0_4_;
    fVar207 = auVar90._4_4_;
    fVar208 = auVar90._8_4_;
    fVar285 = auVar90._12_4_;
    local_640._0_4_ = auVar75._0_4_;
    local_640._4_4_ = auVar75._4_4_;
    fStack_638 = auVar75._8_4_;
    fStack_634 = auVar75._12_4_;
    fVar174 = auVar78._0_4_;
    fVar166 = auVar78._4_4_;
    fVar169 = auVar78._8_4_;
    fVar171 = auVar78._12_4_;
    fVar256 = auVar246._0_4_ * fVar174 + fVar248 * fVar149;
    fVar266 = auVar246._4_4_ * fVar166 + fVar150 * fVar193;
    fVar267 = auVar246._8_4_ * fVar169 + fVar168 * fVar148;
    fVar268 = auVar246._12_4_ * fVar171 + fVar173 * fVar247;
    fVar269 = auVar246._16_4_ * fVar174 + fVar248 * fVar167;
    fVar270 = auVar246._20_4_ * fVar166 + fVar150 * fVar170;
    fVar271 = auVar246._24_4_ * fVar169 + fVar168 * fVar172;
    fVar146 = auVar117._0_4_;
    fVar147 = auVar117._4_4_;
    fVar194 = auVar117._8_4_;
    fVar195 = auVar117._12_4_;
    fVar272 = auVar246._0_4_ * fVar146 + fVar206 * fVar149;
    fVar276 = auVar246._4_4_ * fVar147 + fVar207 * fVar193;
    fVar277 = auVar246._8_4_ * fVar194 + fVar208 * fVar148;
    fVar278 = auVar246._12_4_ * fVar195 + fVar285 * fVar247;
    fVar279 = auVar246._16_4_ * fVar146 + fVar206 * fVar167;
    fVar281 = auVar246._20_4_ * fVar147 + fVar207 * fVar170;
    fVar283 = auVar246._24_4_ * fVar194 + fVar208 * fVar172;
    auVar199 = vshufps_avx(auVar116,auVar116,0xaa);
    auVar75 = vshufps_avx(auVar116,auVar116,0xff);
    fVar128 = fVar171 + 0.0;
    auVar97 = vshufps_avx(auVar93,auVar93,0xaa);
    auVar90 = vshufps_avx(auVar93,auVar93,0xff);
    auVar83._0_4_ =
         fVar149 * (fVar248 * auVar246._0_4_ + auVar191._0_4_ * fVar149) + auVar246._0_4_ * fVar256;
    auVar83._4_4_ =
         fVar193 * (fVar150 * auVar246._4_4_ + auVar191._4_4_ * fVar193) + auVar246._4_4_ * fVar266;
    auVar83._8_4_ =
         fVar148 * (fVar168 * auVar246._8_4_ + auVar191._8_4_ * fVar148) + auVar246._8_4_ * fVar267;
    auVar83._12_4_ =
         fVar247 * (fVar173 * auVar246._12_4_ + fVar294 * fVar247) + auVar246._12_4_ * fVar268;
    auVar83._16_4_ =
         fVar167 * (fVar248 * auVar246._16_4_ + auVar191._0_4_ * fVar167) +
         auVar246._16_4_ * fVar269;
    auVar83._20_4_ =
         fVar170 * (fVar150 * auVar246._20_4_ + auVar191._4_4_ * fVar170) +
         auVar246._20_4_ * fVar270;
    auVar83._24_4_ =
         fVar172 * (fVar168 * auVar246._24_4_ + auVar191._8_4_ * fVar172) +
         auVar246._24_4_ * fVar271;
    auVar83._28_4_ = fVar294 + 1.0 + fVar195;
    auVar142._0_4_ =
         fVar149 * (fVar206 * auVar246._0_4_ + fVar149 * (float)local_640._0_4_) +
         auVar246._0_4_ * fVar272;
    auVar142._4_4_ =
         fVar193 * (fVar207 * auVar246._4_4_ + fVar193 * (float)local_640._4_4_) +
         auVar246._4_4_ * fVar276;
    auVar142._8_4_ =
         fVar148 * (fVar208 * auVar246._8_4_ + fVar148 * fStack_638) + auVar246._8_4_ * fVar277;
    auVar142._12_4_ =
         fVar247 * (fVar285 * auVar246._12_4_ + fVar247 * fStack_634) + auVar246._12_4_ * fVar278;
    auVar142._16_4_ =
         fVar167 * (fVar206 * auVar246._16_4_ + fVar167 * (float)local_640._0_4_) +
         auVar246._16_4_ * fVar279;
    auVar142._20_4_ =
         fVar170 * (fVar207 * auVar246._20_4_ + fVar170 * (float)local_640._4_4_) +
         auVar246._20_4_ * fVar281;
    auVar142._24_4_ =
         fVar172 * (fVar208 * auVar246._24_4_ + fVar172 * fStack_638) + auVar246._24_4_ * fVar283;
    auVar142._28_4_ = fVar294 + 1.0 + fVar195;
    auVar163._0_4_ =
         fVar149 * fVar256 + auVar246._0_4_ * (auVar112._0_4_ * auVar246._0_4_ + fVar149 * fVar174);
    auVar163._4_4_ =
         fVar193 * fVar266 + auVar246._4_4_ * (auVar112._4_4_ * auVar246._4_4_ + fVar193 * fVar166);
    auVar163._8_4_ =
         fVar148 * fVar267 + auVar246._8_4_ * (auVar112._8_4_ * auVar246._8_4_ + fVar148 * fVar169);
    auVar163._12_4_ =
         fVar247 * fVar268 +
         auVar246._12_4_ * (auVar112._12_4_ * auVar246._12_4_ + fVar247 * fVar171);
    auVar163._16_4_ =
         fVar167 * fVar269 +
         auVar246._16_4_ * (auVar112._0_4_ * auVar246._16_4_ + fVar167 * fVar174);
    auVar163._20_4_ =
         fVar170 * fVar270 +
         auVar246._20_4_ * (auVar112._4_4_ * auVar246._20_4_ + fVar170 * fVar166);
    auVar163._24_4_ =
         fVar172 * fVar271 +
         auVar246._24_4_ * (auVar112._8_4_ * auVar246._24_4_ + fVar172 * fVar169);
    auVar163._28_4_ = fVar195 + fVar128;
    auVar255._0_4_ =
         fVar149 * fVar272 + auVar246._0_4_ * (auVar89._0_4_ * auVar246._0_4_ + fVar149 * fVar146);
    auVar255._4_4_ =
         fVar193 * fVar276 + auVar246._4_4_ * (auVar89._4_4_ * auVar246._4_4_ + fVar193 * fVar147);
    auVar255._8_4_ =
         fVar148 * fVar277 + auVar246._8_4_ * (auVar89._8_4_ * auVar246._8_4_ + fVar148 * fVar194);
    auVar255._12_4_ =
         fVar247 * fVar278 +
         auVar246._12_4_ * (auVar89._12_4_ * auVar246._12_4_ + fVar247 * fVar195);
    auVar255._16_4_ =
         fVar167 * fVar279 + auVar246._16_4_ * (auVar89._0_4_ * auVar246._16_4_ + fVar167 * fVar146)
    ;
    auVar255._20_4_ =
         fVar170 * fVar281 + auVar246._20_4_ * (auVar89._4_4_ * auVar246._20_4_ + fVar170 * fVar147)
    ;
    auVar255._24_4_ =
         fVar172 * fVar283 + auVar246._24_4_ * (auVar89._8_4_ * auVar246._24_4_ + fVar172 * fVar194)
    ;
    auVar255._28_4_ = fVar128 + fVar195 + 0.0;
    local_1c0._0_4_ = fVar149 * auVar83._0_4_ + auVar246._0_4_ * auVar163._0_4_;
    local_1c0._4_4_ = fVar193 * auVar83._4_4_ + auVar246._4_4_ * auVar163._4_4_;
    local_1c0._8_4_ = fVar148 * auVar83._8_4_ + auVar246._8_4_ * auVar163._8_4_;
    local_1c0._12_4_ = fVar247 * auVar83._12_4_ + auVar246._12_4_ * auVar163._12_4_;
    local_1c0._16_4_ = fVar167 * auVar83._16_4_ + auVar246._16_4_ * auVar163._16_4_;
    local_1c0._20_4_ = fVar170 * auVar83._20_4_ + auVar246._20_4_ * auVar163._20_4_;
    local_1c0._24_4_ = fVar172 * auVar83._24_4_ + auVar246._24_4_ * auVar163._24_4_;
    local_1c0._28_4_ = fVar294 + fVar173 + fVar195 + 0.0;
    local_1e0._0_4_ = fVar149 * auVar142._0_4_ + auVar246._0_4_ * auVar255._0_4_;
    local_1e0._4_4_ = fVar193 * auVar142._4_4_ + auVar246._4_4_ * auVar255._4_4_;
    local_1e0._8_4_ = fVar148 * auVar142._8_4_ + auVar246._8_4_ * auVar255._8_4_;
    local_1e0._12_4_ = fVar247 * auVar142._12_4_ + auVar246._12_4_ * auVar255._12_4_;
    local_1e0._16_4_ = fVar167 * auVar142._16_4_ + auVar246._16_4_ * auVar255._16_4_;
    local_1e0._20_4_ = fVar170 * auVar142._20_4_ + auVar246._20_4_ * auVar255._20_4_;
    local_1e0._24_4_ = fVar172 * auVar142._24_4_ + auVar246._24_4_ * auVar255._24_4_;
    local_1e0._28_4_ = fVar294 + fVar173 + fVar128;
    auVar17 = vsubps_avx(auVar163,auVar83);
    auVar81 = vsubps_avx(auVar255,auVar142);
    local_5e0 = auVar98._0_4_;
    fStack_5dc = auVar98._4_4_;
    fStack_5d8 = auVar98._8_4_;
    fStack_5d4 = auVar98._12_4_;
    local_220 = local_5e0 * auVar17._0_4_ * 3.0;
    fStack_21c = fStack_5dc * auVar17._4_4_ * 3.0;
    auVar18._4_4_ = fStack_21c;
    auVar18._0_4_ = local_220;
    fStack_218 = fStack_5d8 * auVar17._8_4_ * 3.0;
    auVar18._8_4_ = fStack_218;
    fStack_214 = fStack_5d4 * auVar17._12_4_ * 3.0;
    auVar18._12_4_ = fStack_214;
    fStack_210 = local_5e0 * auVar17._16_4_ * 3.0;
    auVar18._16_4_ = fStack_210;
    fStack_20c = fStack_5dc * auVar17._20_4_ * 3.0;
    auVar18._20_4_ = fStack_20c;
    fStack_208 = fStack_5d8 * auVar17._24_4_ * 3.0;
    auVar18._24_4_ = fStack_208;
    auVar18._28_4_ = auVar17._28_4_;
    fVar266 = local_5e0 * auVar81._0_4_ * 3.0;
    fVar168 = fStack_5dc * auVar81._4_4_ * 3.0;
    auVar19._4_4_ = fVar168;
    auVar19._0_4_ = fVar266;
    fVar267 = fStack_5d8 * auVar81._8_4_ * 3.0;
    auVar19._8_4_ = fVar267;
    fVar173 = fStack_5d4 * auVar81._12_4_ * 3.0;
    auVar19._12_4_ = fVar173;
    fVar268 = local_5e0 * auVar81._16_4_ * 3.0;
    auVar19._16_4_ = fVar268;
    fVar269 = fStack_5dc * auVar81._20_4_ * 3.0;
    auVar19._20_4_ = fVar269;
    fVar270 = fStack_5d8 * auVar81._24_4_ * 3.0;
    auVar19._24_4_ = fVar270;
    auVar19._28_4_ = auVar163._28_4_;
    auVar18 = vsubps_avx(local_1c0,auVar18);
    auVar81 = vperm2f128_avx(auVar18,auVar18,1);
    auVar81 = vshufps_avx(auVar81,auVar18,0x30);
    auVar81 = vshufps_avx(auVar18,auVar81,0x29);
    auVar19 = vsubps_avx(local_1e0,auVar19);
    auVar18 = vperm2f128_avx(auVar19,auVar19,1);
    auVar18 = vshufps_avx(auVar18,auVar19,0x30);
    auVar82 = vshufps_avx(auVar19,auVar18,0x29);
    fVar296 = auVar97._0_4_;
    fVar301 = auVar97._4_4_;
    fVar302 = auVar97._8_4_;
    fVar174 = auVar90._0_4_;
    fVar147 = auVar90._4_4_;
    fVar171 = auVar90._8_4_;
    fVar248 = auVar90._12_4_;
    fVar295 = auVar75._12_4_;
    auVar98 = vshufps_avx(auVar155,auVar155,0xaa);
    fVar146 = auVar98._0_4_;
    fVar169 = auVar98._4_4_;
    fVar195 = auVar98._8_4_;
    fVar256 = auVar98._12_4_;
    fVar278 = auVar246._0_4_ * fVar146 + fVar296 * fVar149;
    fVar279 = auVar246._4_4_ * fVar169 + fVar301 * fVar193;
    fVar281 = auVar246._8_4_ * fVar195 + fVar302 * fVar148;
    fVar283 = auVar246._12_4_ * fVar256 + auVar97._12_4_ * fVar247;
    fVar280 = auVar246._16_4_ * fVar146 + fVar296 * fVar167;
    fVar282 = auVar246._20_4_ * fVar169 + fVar301 * fVar170;
    fVar284 = auVar246._24_4_ * fVar195 + fVar302 * fVar172;
    fVar285 = fVar295 + fVar294 + fVar285;
    auVar98 = vshufps_avx(auVar155,auVar155,0xff);
    fVar166 = auVar98._0_4_;
    fVar194 = auVar98._4_4_;
    fVar128 = auVar98._8_4_;
    fVar150 = auVar98._12_4_;
    fVar271 = auVar246._0_4_ * fVar166 + fVar149 * fVar174;
    fVar206 = auVar246._4_4_ * fVar194 + fVar193 * fVar147;
    fVar272 = auVar246._8_4_ * fVar128 + fVar148 * fVar171;
    fVar207 = auVar246._12_4_ * fVar150 + fVar247 * fVar248;
    fVar276 = auVar246._16_4_ * fVar166 + fVar167 * fVar174;
    fVar208 = auVar246._20_4_ * fVar194 + fVar170 * fVar147;
    fVar277 = auVar246._24_4_ * fVar128 + fVar172 * fVar171;
    auVar98 = vshufps_avx(auVar132,auVar132,0xaa);
    auVar191 = vshufps_avx(auVar132,auVar132,0xff);
    fVar294 = auVar191._12_4_;
    auVar84._0_4_ =
         auVar246._0_4_ * fVar278 + fVar149 * (fVar296 * auVar246._0_4_ + auVar199._0_4_ * fVar149);
    auVar84._4_4_ =
         auVar246._4_4_ * fVar279 + fVar193 * (fVar301 * auVar246._4_4_ + auVar199._4_4_ * fVar193);
    auVar84._8_4_ =
         auVar246._8_4_ * fVar281 + fVar148 * (fVar302 * auVar246._8_4_ + auVar199._8_4_ * fVar148);
    auVar84._12_4_ =
         auVar246._12_4_ * fVar283 +
         fVar247 * (auVar97._12_4_ * auVar246._12_4_ + auVar199._12_4_ * fVar247);
    auVar84._16_4_ =
         auVar246._16_4_ * fVar280 +
         fVar167 * (fVar296 * auVar246._16_4_ + auVar199._0_4_ * fVar167);
    auVar84._20_4_ =
         auVar246._20_4_ * fVar282 +
         fVar170 * (fVar301 * auVar246._20_4_ + auVar199._4_4_ * fVar170);
    auVar84._24_4_ =
         auVar246._24_4_ * fVar284 +
         fVar172 * (fVar302 * auVar246._24_4_ + auVar199._8_4_ * fVar172);
    auVar84._28_4_ = fVar294 + auVar19._28_4_ + auVar18._28_4_;
    auVar293._0_4_ =
         auVar246._0_4_ * fVar271 + fVar149 * (auVar246._0_4_ * fVar174 + auVar75._0_4_ * fVar149);
    auVar293._4_4_ =
         auVar246._4_4_ * fVar206 + fVar193 * (auVar246._4_4_ * fVar147 + auVar75._4_4_ * fVar193);
    auVar293._8_4_ =
         auVar246._8_4_ * fVar272 + fVar148 * (auVar246._8_4_ * fVar171 + auVar75._8_4_ * fVar148);
    auVar293._12_4_ =
         auVar246._12_4_ * fVar207 + fVar247 * (auVar246._12_4_ * fVar248 + fVar295 * fVar247);
    auVar293._16_4_ =
         auVar246._16_4_ * fVar276 + fVar167 * (auVar246._16_4_ * fVar174 + auVar75._0_4_ * fVar167)
    ;
    auVar293._20_4_ =
         auVar246._20_4_ * fVar208 + fVar170 * (auVar246._20_4_ * fVar147 + auVar75._4_4_ * fVar170)
    ;
    auVar293._24_4_ =
         auVar246._24_4_ * fVar277 + fVar172 * (auVar246._24_4_ * fVar171 + auVar75._8_4_ * fVar172)
    ;
    auVar293._28_4_ = fVar294 + auVar18._28_4_ + auVar163._28_4_;
    auVar18 = vperm2f128_avx(local_1c0,local_1c0,1);
    auVar18 = vshufps_avx(auVar18,local_1c0,0x30);
    auVar83 = vshufps_avx(local_1c0,auVar18,0x29);
    auVar164._0_4_ =
         fVar149 * fVar278 + auVar246._0_4_ * (auVar98._0_4_ * auVar246._0_4_ + fVar149 * fVar146);
    auVar164._4_4_ =
         fVar193 * fVar279 + auVar246._4_4_ * (auVar98._4_4_ * auVar246._4_4_ + fVar193 * fVar169);
    auVar164._8_4_ =
         fVar148 * fVar281 + auVar246._8_4_ * (auVar98._8_4_ * auVar246._8_4_ + fVar148 * fVar195);
    auVar164._12_4_ =
         fVar247 * fVar283 +
         auVar246._12_4_ * (auVar98._12_4_ * auVar246._12_4_ + fVar247 * fVar256);
    auVar164._16_4_ =
         fVar167 * fVar280 + auVar246._16_4_ * (auVar98._0_4_ * auVar246._16_4_ + fVar167 * fVar146)
    ;
    auVar164._20_4_ =
         fVar170 * fVar282 + auVar246._20_4_ * (auVar98._4_4_ * auVar246._20_4_ + fVar170 * fVar169)
    ;
    auVar164._24_4_ =
         fVar172 * fVar284 + auVar246._24_4_ * (auVar98._8_4_ * auVar246._24_4_ + fVar172 * fVar195)
    ;
    auVar164._28_4_ = fVar285 + auVar98._12_4_ + fVar256;
    auVar205._0_4_ =
         fVar149 * fVar271 + auVar246._0_4_ * (auVar191._0_4_ * auVar246._0_4_ + fVar149 * fVar166);
    auVar205._4_4_ =
         fVar193 * fVar206 + auVar246._4_4_ * (auVar191._4_4_ * auVar246._4_4_ + fVar193 * fVar194);
    auVar205._8_4_ =
         fVar148 * fVar272 + auVar246._8_4_ * (auVar191._8_4_ * auVar246._8_4_ + fVar148 * fVar128);
    auVar205._12_4_ =
         fVar247 * fVar207 + auVar246._12_4_ * (fVar294 * auVar246._12_4_ + fVar247 * fVar150);
    auVar205._16_4_ =
         fVar167 * fVar276 +
         auVar246._16_4_ * (auVar191._0_4_ * auVar246._16_4_ + fVar167 * fVar166);
    auVar205._20_4_ =
         fVar170 * fVar208 +
         auVar246._20_4_ * (auVar191._4_4_ * auVar246._20_4_ + fVar170 * fVar194);
    auVar205._24_4_ =
         fVar172 * fVar277 +
         auVar246._24_4_ * (auVar191._8_4_ * auVar246._24_4_ + fVar172 * fVar128);
    auVar205._28_4_ = fVar295 + fVar248 + fVar294 + fVar150;
    auVar216._0_4_ = fVar149 * auVar84._0_4_ + auVar246._0_4_ * auVar164._0_4_;
    auVar216._4_4_ = fVar193 * auVar84._4_4_ + auVar246._4_4_ * auVar164._4_4_;
    auVar216._8_4_ = fVar148 * auVar84._8_4_ + auVar246._8_4_ * auVar164._8_4_;
    auVar216._12_4_ = fVar247 * auVar84._12_4_ + auVar246._12_4_ * auVar164._12_4_;
    auVar216._16_4_ = fVar167 * auVar84._16_4_ + auVar246._16_4_ * auVar164._16_4_;
    auVar216._20_4_ = fVar170 * auVar84._20_4_ + auVar246._20_4_ * auVar164._20_4_;
    auVar216._24_4_ = fVar172 * auVar84._24_4_ + auVar246._24_4_ * auVar164._24_4_;
    auVar216._28_4_ = fVar285 + fVar294 + fVar150;
    auVar231._0_4_ = fVar149 * auVar293._0_4_ + auVar246._0_4_ * auVar205._0_4_;
    auVar231._4_4_ = fVar193 * auVar293._4_4_ + auVar246._4_4_ * auVar205._4_4_;
    auVar231._8_4_ = fVar148 * auVar293._8_4_ + auVar246._8_4_ * auVar205._8_4_;
    auVar231._12_4_ = fVar247 * auVar293._12_4_ + auVar246._12_4_ * auVar205._12_4_;
    auVar231._16_4_ = fVar167 * auVar293._16_4_ + auVar246._16_4_ * auVar205._16_4_;
    auVar231._20_4_ = fVar170 * auVar293._20_4_ + auVar246._20_4_ * auVar205._20_4_;
    auVar231._24_4_ = fVar172 * auVar293._24_4_ + auVar246._24_4_ * auVar205._24_4_;
    auVar231._28_4_ = auVar16._28_4_ + auVar246._28_4_;
    auVar18 = vsubps_avx(auVar164,auVar84);
    auVar16 = vsubps_avx(auVar205,auVar293);
    local_240 = local_5e0 * auVar18._0_4_ * 3.0;
    fStack_23c = fStack_5dc * auVar18._4_4_ * 3.0;
    auVar14._4_4_ = fStack_23c;
    auVar14._0_4_ = local_240;
    fStack_238 = fStack_5d8 * auVar18._8_4_ * 3.0;
    auVar14._8_4_ = fStack_238;
    fStack_234 = fStack_5d4 * auVar18._12_4_ * 3.0;
    auVar14._12_4_ = fStack_234;
    fStack_230 = local_5e0 * auVar18._16_4_ * 3.0;
    auVar14._16_4_ = fStack_230;
    fStack_22c = fStack_5dc * auVar18._20_4_ * 3.0;
    auVar14._20_4_ = fStack_22c;
    fStack_228 = fStack_5d8 * auVar18._24_4_ * 3.0;
    auVar14._24_4_ = fStack_228;
    auVar14._28_4_ = auVar205._28_4_;
    local_260 = local_5e0 * auVar16._0_4_ * 3.0;
    fStack_25c = fStack_5dc * auVar16._4_4_ * 3.0;
    auVar15._4_4_ = fStack_25c;
    auVar15._0_4_ = local_260;
    fStack_258 = fStack_5d8 * auVar16._8_4_ * 3.0;
    auVar15._8_4_ = fStack_258;
    fStack_254 = fStack_5d4 * auVar16._12_4_ * 3.0;
    auVar15._12_4_ = fStack_254;
    local_5e0 = local_5e0 * auVar16._16_4_ * 3.0;
    auVar15._16_4_ = local_5e0;
    fStack_5dc = fStack_5dc * auVar16._20_4_ * 3.0;
    auVar15._20_4_ = fStack_5dc;
    fStack_5d8 = fStack_5d8 * auVar16._24_4_ * 3.0;
    auVar15._24_4_ = fStack_5d8;
    auVar15._28_4_ = fStack_5d4;
    auVar18 = vperm2f128_avx(auVar216,auVar216,1);
    auVar18 = vshufps_avx(auVar18,auVar216,0x30);
    auVar84 = vshufps_avx(auVar216,auVar18,0x29);
    auVar16 = vsubps_avx(auVar216,auVar14);
    auVar18 = vperm2f128_avx(auVar16,auVar16,1);
    auVar18 = vshufps_avx(auVar18,auVar16,0x30);
    auVar14 = vshufps_avx(auVar16,auVar18,0x29);
    auVar16 = vsubps_avx(auVar231,auVar15);
    auVar18 = vperm2f128_avx(auVar16,auVar16,1);
    auVar18 = vshufps_avx(auVar18,auVar16,0x30);
    auVar15 = vshufps_avx(auVar16,auVar18,0x29);
    auVar19 = vsubps_avx(auVar216,local_1c0);
    auVar20 = vsubps_avx(auVar84,auVar83);
    fVar149 = auVar20._0_4_ + auVar19._0_4_;
    fVar174 = auVar20._4_4_ + auVar19._4_4_;
    fVar146 = auVar20._8_4_ + auVar19._8_4_;
    fVar166 = auVar20._12_4_ + auVar19._12_4_;
    fVar193 = auVar20._16_4_ + auVar19._16_4_;
    fVar147 = auVar20._20_4_ + auVar19._20_4_;
    fVar169 = auVar20._24_4_ + auVar19._24_4_;
    auVar16 = vperm2f128_avx(local_1e0,local_1e0,1);
    auVar16 = vshufps_avx(auVar16,local_1e0,0x30);
    local_200 = vshufps_avx(local_1e0,auVar16,0x29);
    auVar16 = vperm2f128_avx(auVar231,auVar231,1);
    auVar16 = vshufps_avx(auVar16,auVar231,0x30);
    auVar142 = vshufps_avx(auVar231,auVar16,0x29);
    auVar16 = vsubps_avx(auVar231,local_1e0);
    auVar164 = vsubps_avx(auVar142,local_200);
    fVar194 = auVar16._0_4_ + auVar164._0_4_;
    fVar148 = auVar16._4_4_ + auVar164._4_4_;
    fVar171 = auVar16._8_4_ + auVar164._8_4_;
    fVar195 = auVar16._12_4_ + auVar164._12_4_;
    fVar128 = auVar16._16_4_ + auVar164._16_4_;
    fVar247 = auVar16._20_4_ + auVar164._20_4_;
    fVar248 = auVar16._24_4_ + auVar164._24_4_;
    fVar256 = auVar16._28_4_;
    auVar16._4_4_ = local_1e0._4_4_ * fVar174;
    auVar16._0_4_ = local_1e0._0_4_ * fVar149;
    auVar16._8_4_ = local_1e0._8_4_ * fVar146;
    auVar16._12_4_ = local_1e0._12_4_ * fVar166;
    auVar16._16_4_ = local_1e0._16_4_ * fVar193;
    auVar16._20_4_ = local_1e0._20_4_ * fVar147;
    auVar16._24_4_ = local_1e0._24_4_ * fVar169;
    auVar16._28_4_ = fVar256;
    auVar21._4_4_ = fVar148 * local_1c0._4_4_;
    auVar21._0_4_ = fVar194 * local_1c0._0_4_;
    auVar21._8_4_ = fVar171 * local_1c0._8_4_;
    auVar21._12_4_ = fVar195 * local_1c0._12_4_;
    auVar21._16_4_ = fVar128 * local_1c0._16_4_;
    auVar21._20_4_ = fVar247 * local_1c0._20_4_;
    auVar21._24_4_ = fVar248 * local_1c0._24_4_;
    auVar21._28_4_ = auVar18._28_4_;
    auVar16 = vsubps_avx(auVar16,auVar21);
    local_220 = local_1c0._0_4_ + local_220;
    fStack_21c = local_1c0._4_4_ + fStack_21c;
    fStack_218 = local_1c0._8_4_ + fStack_218;
    fStack_214 = local_1c0._12_4_ + fStack_214;
    fStack_210 = local_1c0._16_4_ + fStack_210;
    fStack_20c = local_1c0._20_4_ + fStack_20c;
    fStack_208 = local_1c0._24_4_ + fStack_208;
    fStack_204 = local_1c0._28_4_ + auVar17._28_4_;
    fVar266 = local_1e0._0_4_ + fVar266;
    fVar168 = local_1e0._4_4_ + fVar168;
    fVar267 = local_1e0._8_4_ + fVar267;
    fVar173 = local_1e0._12_4_ + fVar173;
    fVar268 = local_1e0._16_4_ + fVar268;
    fVar269 = local_1e0._20_4_ + fVar269;
    fVar270 = local_1e0._24_4_ + fVar270;
    auVar17._4_4_ = fVar168 * fVar174;
    auVar17._0_4_ = fVar266 * fVar149;
    auVar17._8_4_ = fVar267 * fVar146;
    auVar17._12_4_ = fVar173 * fVar166;
    auVar17._16_4_ = fVar268 * fVar193;
    auVar17._20_4_ = fVar269 * fVar147;
    auVar17._24_4_ = fVar270 * fVar169;
    auVar17._28_4_ = fVar256;
    auVar22._4_4_ = fVar148 * fStack_21c;
    auVar22._0_4_ = fVar194 * local_220;
    auVar22._8_4_ = fVar171 * fStack_218;
    auVar22._12_4_ = fVar195 * fStack_214;
    auVar22._16_4_ = fVar128 * fStack_210;
    auVar22._20_4_ = fVar247 * fStack_20c;
    auVar22._24_4_ = fVar248 * fStack_208;
    auVar22._28_4_ = fStack_204;
    auVar17 = vsubps_avx(auVar17,auVar22);
    auVar23._4_4_ = auVar82._4_4_ * fVar174;
    auVar23._0_4_ = auVar82._0_4_ * fVar149;
    auVar23._8_4_ = auVar82._8_4_ * fVar146;
    auVar23._12_4_ = auVar82._12_4_ * fVar166;
    auVar23._16_4_ = auVar82._16_4_ * fVar193;
    auVar23._20_4_ = auVar82._20_4_ * fVar147;
    auVar23._24_4_ = auVar82._24_4_ * fVar169;
    auVar23._28_4_ = fVar256;
    local_640._0_4_ = auVar81._0_4_;
    local_640._4_4_ = auVar81._4_4_;
    fStack_638 = auVar81._8_4_;
    fStack_634 = auVar81._12_4_;
    fStack_630 = auVar81._16_4_;
    fStack_62c = auVar81._20_4_;
    fStack_628 = auVar81._24_4_;
    auVar24._4_4_ = fVar148 * (float)local_640._4_4_;
    auVar24._0_4_ = fVar194 * (float)local_640._0_4_;
    auVar24._8_4_ = fVar171 * fStack_638;
    auVar24._12_4_ = fVar195 * fStack_634;
    auVar24._16_4_ = fVar128 * fStack_630;
    auVar24._20_4_ = fVar247 * fStack_62c;
    auVar24._24_4_ = fVar248 * fStack_628;
    auVar24._28_4_ = 0x40400000;
    auVar21 = vsubps_avx(auVar23,auVar24);
    auVar25._4_4_ = local_200._4_4_ * fVar174;
    auVar25._0_4_ = local_200._0_4_ * fVar149;
    auVar25._8_4_ = local_200._8_4_ * fVar146;
    auVar25._12_4_ = local_200._12_4_ * fVar166;
    auVar25._16_4_ = local_200._16_4_ * fVar193;
    auVar25._20_4_ = local_200._20_4_ * fVar147;
    auVar25._24_4_ = local_200._24_4_ * fVar169;
    auVar25._28_4_ = fVar256;
    auVar26._4_4_ = auVar83._4_4_ * fVar148;
    auVar26._0_4_ = auVar83._0_4_ * fVar194;
    auVar26._8_4_ = auVar83._8_4_ * fVar171;
    auVar26._12_4_ = auVar83._12_4_ * fVar195;
    auVar26._16_4_ = auVar83._16_4_ * fVar128;
    auVar26._20_4_ = auVar83._20_4_ * fVar247;
    auVar26._24_4_ = auVar83._24_4_ * fVar248;
    auVar26._28_4_ = local_200._28_4_;
    auVar22 = vsubps_avx(auVar25,auVar26);
    auVar27._4_4_ = auVar231._4_4_ * fVar174;
    auVar27._0_4_ = auVar231._0_4_ * fVar149;
    auVar27._8_4_ = auVar231._8_4_ * fVar146;
    auVar27._12_4_ = auVar231._12_4_ * fVar166;
    auVar27._16_4_ = auVar231._16_4_ * fVar193;
    auVar27._20_4_ = auVar231._20_4_ * fVar147;
    auVar27._24_4_ = auVar231._24_4_ * fVar169;
    auVar27._28_4_ = fVar256;
    auVar28._4_4_ = fVar148 * auVar216._4_4_;
    auVar28._0_4_ = fVar194 * auVar216._0_4_;
    auVar28._8_4_ = fVar171 * auVar216._8_4_;
    auVar28._12_4_ = fVar195 * auVar216._12_4_;
    auVar28._16_4_ = fVar128 * auVar216._16_4_;
    auVar28._20_4_ = fVar247 * auVar216._20_4_;
    auVar28._24_4_ = fVar248 * auVar216._24_4_;
    auVar28._28_4_ = auVar82._28_4_;
    auVar23 = vsubps_avx(auVar27,auVar28);
    local_240 = auVar216._0_4_ + local_240;
    fStack_23c = auVar216._4_4_ + fStack_23c;
    fStack_238 = auVar216._8_4_ + fStack_238;
    fStack_234 = auVar216._12_4_ + fStack_234;
    fStack_230 = auVar216._16_4_ + fStack_230;
    fStack_22c = auVar216._20_4_ + fStack_22c;
    fStack_228 = auVar216._24_4_ + fStack_228;
    fStack_224 = auVar216._28_4_ + auVar205._28_4_;
    local_260 = auVar231._0_4_ + local_260;
    fStack_25c = auVar231._4_4_ + fStack_25c;
    fStack_258 = auVar231._8_4_ + fStack_258;
    fStack_254 = auVar231._12_4_ + fStack_254;
    fStack_250 = auVar231._16_4_ + local_5e0;
    fStack_24c = auVar231._20_4_ + fStack_5dc;
    fStack_248 = auVar231._24_4_ + fStack_5d8;
    fStack_244 = auVar231._28_4_ + fStack_5d4;
    auVar29._4_4_ = fStack_25c * fVar174;
    auVar29._0_4_ = local_260 * fVar149;
    auVar29._8_4_ = fStack_258 * fVar146;
    auVar29._12_4_ = fStack_254 * fVar166;
    auVar29._16_4_ = fStack_250 * fVar193;
    auVar29._20_4_ = fStack_24c * fVar147;
    auVar29._24_4_ = fStack_248 * fVar169;
    auVar29._28_4_ = auVar231._28_4_ + fStack_5d4;
    auVar30._4_4_ = fStack_23c * fVar148;
    auVar30._0_4_ = local_240 * fVar194;
    auVar30._8_4_ = fStack_238 * fVar171;
    auVar30._12_4_ = fStack_234 * fVar195;
    auVar30._16_4_ = fStack_230 * fVar128;
    auVar30._20_4_ = fStack_22c * fVar247;
    auVar30._24_4_ = fStack_228 * fVar248;
    auVar30._28_4_ = fStack_224;
    auVar24 = vsubps_avx(auVar29,auVar30);
    auVar31._4_4_ = auVar15._4_4_ * fVar174;
    auVar31._0_4_ = auVar15._0_4_ * fVar149;
    auVar31._8_4_ = auVar15._8_4_ * fVar146;
    auVar31._12_4_ = auVar15._12_4_ * fVar166;
    auVar31._16_4_ = auVar15._16_4_ * fVar193;
    auVar31._20_4_ = auVar15._20_4_ * fVar147;
    auVar31._24_4_ = auVar15._24_4_ * fVar169;
    auVar31._28_4_ = fStack_224;
    auVar32._4_4_ = fVar148 * auVar14._4_4_;
    auVar32._0_4_ = fVar194 * auVar14._0_4_;
    auVar32._8_4_ = fVar171 * auVar14._8_4_;
    auVar32._12_4_ = fVar195 * auVar14._12_4_;
    auVar32._16_4_ = fVar128 * auVar14._16_4_;
    auVar32._20_4_ = fVar247 * auVar14._20_4_;
    auVar32._24_4_ = fVar248 * auVar14._24_4_;
    auVar32._28_4_ = auVar14._28_4_;
    auVar25 = vsubps_avx(auVar31,auVar32);
    auVar33._4_4_ = auVar142._4_4_ * fVar174;
    auVar33._0_4_ = auVar142._0_4_ * fVar149;
    auVar33._8_4_ = auVar142._8_4_ * fVar146;
    auVar33._12_4_ = auVar142._12_4_ * fVar166;
    auVar33._16_4_ = auVar142._16_4_ * fVar193;
    auVar33._20_4_ = auVar142._20_4_ * fVar147;
    auVar33._24_4_ = auVar142._24_4_ * fVar169;
    auVar33._28_4_ = auVar20._28_4_ + auVar19._28_4_;
    auVar20._4_4_ = auVar84._4_4_ * fVar148;
    auVar20._0_4_ = auVar84._0_4_ * fVar194;
    auVar20._8_4_ = auVar84._8_4_ * fVar171;
    auVar20._12_4_ = auVar84._12_4_ * fVar195;
    auVar20._16_4_ = auVar84._16_4_ * fVar128;
    auVar20._20_4_ = auVar84._20_4_ * fVar247;
    auVar20._24_4_ = auVar84._24_4_ * fVar248;
    auVar20._28_4_ = fVar256 + auVar164._28_4_;
    auVar20 = vsubps_avx(auVar33,auVar20);
    auVar18 = vminps_avx(auVar16,auVar17);
    auVar81 = vmaxps_avx(auVar16,auVar17);
    auVar16 = vminps_avx(auVar21,auVar22);
    auVar16 = vminps_avx(auVar18,auVar16);
    auVar18 = vmaxps_avx(auVar21,auVar22);
    auVar81 = vmaxps_avx(auVar81,auVar18);
    auVar17 = vminps_avx(auVar23,auVar24);
    auVar18 = vmaxps_avx(auVar23,auVar24);
    auVar19 = vminps_avx(auVar25,auVar20);
    auVar17 = vminps_avx(auVar17,auVar19);
    auVar17 = vminps_avx(auVar16,auVar17);
    auVar16 = vmaxps_avx(auVar25,auVar20);
    auVar18 = vmaxps_avx(auVar18,auVar16);
    auVar18 = vmaxps_avx(auVar81,auVar18);
    auVar81 = vcmpps_avx(auVar17,local_280,2);
    auVar18 = vcmpps_avx(auVar18,local_2a0,5);
    auVar81 = vandps_avx(auVar18,auVar81);
    auVar18 = local_320 & auVar81;
    uVar71 = 0;
    if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar18 >> 0x7f,0) != '\0') ||
          (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar18 >> 0xbf,0) != '\0') ||
        (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar18[0x1f] < '\0')
    {
      auVar18 = vsubps_avx(auVar83,local_1c0);
      auVar16 = vsubps_avx(auVar84,auVar216);
      fVar174 = auVar18._0_4_ + auVar16._0_4_;
      fVar146 = auVar18._4_4_ + auVar16._4_4_;
      fVar166 = auVar18._8_4_ + auVar16._8_4_;
      fVar193 = auVar18._12_4_ + auVar16._12_4_;
      fVar147 = auVar18._16_4_ + auVar16._16_4_;
      fVar169 = auVar18._20_4_ + auVar16._20_4_;
      fVar194 = auVar18._24_4_ + auVar16._24_4_;
      auVar17 = vsubps_avx(local_200,local_1e0);
      auVar19 = vsubps_avx(auVar142,auVar231);
      fVar148 = auVar17._0_4_ + auVar19._0_4_;
      fVar171 = auVar17._4_4_ + auVar19._4_4_;
      fVar195 = auVar17._8_4_ + auVar19._8_4_;
      fVar128 = auVar17._12_4_ + auVar19._12_4_;
      fVar247 = auVar17._16_4_ + auVar19._16_4_;
      fVar248 = auVar17._20_4_ + auVar19._20_4_;
      fVar256 = auVar17._24_4_ + auVar19._24_4_;
      fVar149 = auVar19._28_4_;
      auVar34._4_4_ = local_1e0._4_4_ * fVar146;
      auVar34._0_4_ = local_1e0._0_4_ * fVar174;
      auVar34._8_4_ = local_1e0._8_4_ * fVar166;
      auVar34._12_4_ = local_1e0._12_4_ * fVar193;
      auVar34._16_4_ = local_1e0._16_4_ * fVar147;
      auVar34._20_4_ = local_1e0._20_4_ * fVar169;
      auVar34._24_4_ = local_1e0._24_4_ * fVar194;
      auVar34._28_4_ = local_1e0._28_4_;
      auVar35._4_4_ = local_1c0._4_4_ * fVar171;
      auVar35._0_4_ = local_1c0._0_4_ * fVar148;
      auVar35._8_4_ = local_1c0._8_4_ * fVar195;
      auVar35._12_4_ = local_1c0._12_4_ * fVar128;
      auVar35._16_4_ = local_1c0._16_4_ * fVar247;
      auVar35._20_4_ = local_1c0._20_4_ * fVar248;
      auVar35._24_4_ = local_1c0._24_4_ * fVar256;
      auVar35._28_4_ = local_1c0._28_4_;
      auVar19 = vsubps_avx(auVar34,auVar35);
      auVar36._4_4_ = fVar168 * fVar146;
      auVar36._0_4_ = fVar266 * fVar174;
      auVar36._8_4_ = fVar267 * fVar166;
      auVar36._12_4_ = fVar173 * fVar193;
      auVar36._16_4_ = fVar268 * fVar147;
      auVar36._20_4_ = fVar269 * fVar169;
      auVar36._24_4_ = fVar270 * fVar194;
      auVar36._28_4_ = local_1e0._28_4_;
      auVar37._4_4_ = fVar171 * fStack_21c;
      auVar37._0_4_ = fVar148 * local_220;
      auVar37._8_4_ = fVar195 * fStack_218;
      auVar37._12_4_ = fVar128 * fStack_214;
      auVar37._16_4_ = fVar247 * fStack_210;
      auVar37._20_4_ = fVar248 * fStack_20c;
      auVar37._24_4_ = fVar256 * fStack_208;
      auVar37._28_4_ = fVar149;
      auVar20 = vsubps_avx(auVar36,auVar37);
      auVar38._4_4_ = fVar146 * auVar82._4_4_;
      auVar38._0_4_ = fVar174 * auVar82._0_4_;
      auVar38._8_4_ = fVar166 * auVar82._8_4_;
      auVar38._12_4_ = fVar193 * auVar82._12_4_;
      auVar38._16_4_ = fVar147 * auVar82._16_4_;
      auVar38._20_4_ = fVar169 * auVar82._20_4_;
      auVar38._24_4_ = fVar194 * auVar82._24_4_;
      auVar38._28_4_ = fVar149;
      auVar39._4_4_ = fVar171 * (float)local_640._4_4_;
      auVar39._0_4_ = fVar148 * (float)local_640._0_4_;
      auVar39._8_4_ = fVar195 * fStack_638;
      auVar39._12_4_ = fVar128 * fStack_634;
      auVar39._16_4_ = fVar247 * fStack_630;
      auVar39._20_4_ = fVar248 * fStack_62c;
      auVar39._24_4_ = fVar256 * fStack_628;
      auVar39._28_4_ = local_1e0._28_4_ + auVar163._28_4_;
      auVar82 = vsubps_avx(auVar38,auVar39);
      auVar40._4_4_ = local_200._4_4_ * fVar146;
      auVar40._0_4_ = local_200._0_4_ * fVar174;
      auVar40._8_4_ = local_200._8_4_ * fVar166;
      auVar40._12_4_ = local_200._12_4_ * fVar193;
      auVar40._16_4_ = local_200._16_4_ * fVar147;
      auVar40._20_4_ = local_200._20_4_ * fVar169;
      auVar40._24_4_ = local_200._24_4_ * fVar194;
      auVar40._28_4_ = local_1e0._28_4_ + auVar163._28_4_;
      auVar41._4_4_ = auVar83._4_4_ * fVar171;
      auVar41._0_4_ = auVar83._0_4_ * fVar148;
      auVar41._8_4_ = auVar83._8_4_ * fVar195;
      auVar41._12_4_ = auVar83._12_4_ * fVar128;
      auVar41._16_4_ = auVar83._16_4_ * fVar247;
      auVar41._20_4_ = auVar83._20_4_ * fVar248;
      uVar2 = auVar83._28_4_;
      auVar41._24_4_ = auVar83._24_4_ * fVar256;
      auVar41._28_4_ = uVar2;
      auVar83 = vsubps_avx(auVar40,auVar41);
      auVar42._4_4_ = auVar231._4_4_ * fVar146;
      auVar42._0_4_ = auVar231._0_4_ * fVar174;
      auVar42._8_4_ = auVar231._8_4_ * fVar166;
      auVar42._12_4_ = auVar231._12_4_ * fVar193;
      auVar42._16_4_ = auVar231._16_4_ * fVar147;
      auVar42._20_4_ = auVar231._20_4_ * fVar169;
      auVar42._24_4_ = auVar231._24_4_ * fVar194;
      auVar42._28_4_ = auVar231._28_4_;
      auVar43._4_4_ = auVar216._4_4_ * fVar171;
      auVar43._0_4_ = auVar216._0_4_ * fVar148;
      auVar43._8_4_ = auVar216._8_4_ * fVar195;
      auVar43._12_4_ = auVar216._12_4_ * fVar128;
      auVar43._16_4_ = auVar216._16_4_ * fVar247;
      auVar43._20_4_ = auVar216._20_4_ * fVar248;
      auVar43._24_4_ = auVar216._24_4_ * fVar256;
      auVar43._28_4_ = auVar216._28_4_;
      auVar164 = vsubps_avx(auVar42,auVar43);
      auVar44._4_4_ = fVar146 * fStack_25c;
      auVar44._0_4_ = fVar174 * local_260;
      auVar44._8_4_ = fVar166 * fStack_258;
      auVar44._12_4_ = fVar193 * fStack_254;
      auVar44._16_4_ = fVar147 * fStack_250;
      auVar44._20_4_ = fVar169 * fStack_24c;
      auVar44._24_4_ = fVar194 * fStack_248;
      auVar44._28_4_ = auVar231._28_4_;
      auVar45._4_4_ = fVar171 * fStack_23c;
      auVar45._0_4_ = fVar148 * local_240;
      auVar45._8_4_ = fVar195 * fStack_238;
      auVar45._12_4_ = fVar128 * fStack_234;
      auVar45._16_4_ = fVar247 * fStack_230;
      auVar45._20_4_ = fVar248 * fStack_22c;
      auVar45._24_4_ = fVar256 * fStack_228;
      auVar45._28_4_ = uVar2;
      auVar21 = vsubps_avx(auVar44,auVar45);
      auVar46._4_4_ = fVar146 * auVar15._4_4_;
      auVar46._0_4_ = fVar174 * auVar15._0_4_;
      auVar46._8_4_ = fVar166 * auVar15._8_4_;
      auVar46._12_4_ = fVar193 * auVar15._12_4_;
      auVar46._16_4_ = fVar147 * auVar15._16_4_;
      auVar46._20_4_ = fVar169 * auVar15._20_4_;
      auVar46._24_4_ = fVar194 * auVar15._24_4_;
      auVar46._28_4_ = uVar2;
      auVar47._4_4_ = fVar171 * auVar14._4_4_;
      auVar47._0_4_ = fVar148 * auVar14._0_4_;
      auVar47._8_4_ = fVar195 * auVar14._8_4_;
      auVar47._12_4_ = fVar128 * auVar14._12_4_;
      auVar47._16_4_ = fVar247 * auVar14._16_4_;
      auVar47._20_4_ = fVar248 * auVar14._20_4_;
      auVar47._24_4_ = fVar256 * auVar14._24_4_;
      auVar47._28_4_ = local_200._28_4_;
      auVar14 = vsubps_avx(auVar46,auVar47);
      auVar48._4_4_ = auVar142._4_4_ * fVar146;
      auVar48._0_4_ = auVar142._0_4_ * fVar174;
      auVar48._8_4_ = auVar142._8_4_ * fVar166;
      auVar48._12_4_ = auVar142._12_4_ * fVar193;
      auVar48._16_4_ = auVar142._16_4_ * fVar147;
      auVar48._20_4_ = auVar142._20_4_ * fVar169;
      auVar48._24_4_ = auVar142._24_4_ * fVar194;
      auVar48._28_4_ = auVar18._28_4_ + auVar16._28_4_;
      auVar49._4_4_ = auVar84._4_4_ * fVar171;
      auVar49._0_4_ = auVar84._0_4_ * fVar148;
      auVar49._8_4_ = auVar84._8_4_ * fVar195;
      auVar49._12_4_ = auVar84._12_4_ * fVar128;
      auVar49._16_4_ = auVar84._16_4_ * fVar247;
      auVar49._20_4_ = auVar84._20_4_ * fVar248;
      auVar49._24_4_ = auVar84._24_4_ * fVar256;
      auVar49._28_4_ = auVar17._28_4_ + fVar149;
      auVar84 = vsubps_avx(auVar48,auVar49);
      auVar16 = vminps_avx(auVar19,auVar20);
      auVar18 = vmaxps_avx(auVar19,auVar20);
      auVar17 = vminps_avx(auVar82,auVar83);
      auVar17 = vminps_avx(auVar16,auVar17);
      auVar16 = vmaxps_avx(auVar82,auVar83);
      auVar18 = vmaxps_avx(auVar18,auVar16);
      auVar19 = vminps_avx(auVar164,auVar21);
      auVar16 = vmaxps_avx(auVar164,auVar21);
      auVar82 = vminps_avx(auVar14,auVar84);
      auVar19 = vminps_avx(auVar19,auVar82);
      auVar19 = vminps_avx(auVar17,auVar19);
      auVar17 = vmaxps_avx(auVar14,auVar84);
      auVar16 = vmaxps_avx(auVar16,auVar17);
      auVar16 = vmaxps_avx(auVar18,auVar16);
      auVar18 = vcmpps_avx(auVar19,local_280,2);
      auVar16 = vcmpps_avx(auVar16,local_2a0,5);
      auVar18 = vandps_avx(auVar16,auVar18);
      auVar81 = vandps_avx(auVar81,local_320);
      auVar16 = auVar81 & auVar18;
      if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar16 >> 0x7f,0) != '\0') ||
            (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar16 >> 0xbf,0) != '\0') ||
          (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar16[0x1f] < '\0') {
        auVar81 = vandps_avx(auVar18,auVar81);
        uVar71 = vmovmskps_avx(auVar81);
      }
    }
    if (uVar71 != 0) {
      auStack_490[uVar72] = uVar71;
      uVar3 = vmovlps_avx(local_400);
      *(undefined8 *)(afStack_300 + uVar72 * 2) = uVar3;
      uVar4 = vmovlps_avx(local_6b0);
      auStack_1a0[uVar72] = uVar4;
      uVar72 = (ulong)((int)uVar72 + 1);
    }
    auVar309 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
    do {
      if ((int)uVar72 == 0) {
        if (bVar64) {
          return local_711;
        }
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar80._4_4_ = uVar2;
        auVar80._0_4_ = uVar2;
        auVar80._8_4_ = uVar2;
        auVar80._12_4_ = uVar2;
        auVar98 = vcmpps_avx(local_410,auVar80,2);
        uVar65 = vmovmskps_avx(auVar98);
        uVar65 = (uint)uVar73 & uVar65;
        local_711 = uVar65 != 0;
        if (!local_711) {
          return local_711;
        }
        goto LAB_00f152a7;
      }
      uVar68 = (int)uVar72 - 1;
      uVar70 = (ulong)uVar68;
      uVar71 = auStack_490[uVar70];
      fVar149 = afStack_300[uVar70 * 2];
      fVar174 = afStack_300[uVar70 * 2 + 1];
      local_6b0._8_8_ = 0;
      local_6b0._0_8_ = auStack_1a0[uVar70];
      uVar4 = 0;
      if (uVar71 != 0) {
        for (; (uVar71 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
        }
      }
      uVar71 = uVar71 - 1 & uVar71;
      auStack_490[uVar70] = uVar71;
      if (uVar71 == 0) {
        uVar72 = (ulong)uVar68;
      }
      auVar183._8_4_ = 0x3f800000;
      auVar183._0_8_ = &DAT_3f8000003f800000;
      auVar183._12_4_ = 0x3f800000;
      fVar166 = (float)(uVar4 + 1) * 0.14285715;
      fVar146 = (1.0 - (float)uVar4 * 0.14285715) * fVar149 + fVar174 * (float)uVar4 * 0.14285715;
      fVar149 = (1.0 - fVar166) * fVar149 + fVar174 * fVar166;
      fVar174 = fVar149 - fVar146;
      if (0.16666667 <= fVar174) break;
      auVar98 = vshufps_avx(local_6b0,local_6b0,0x50);
      auVar199 = vsubps_avx(auVar183,auVar98);
      fVar166 = auVar98._0_4_;
      fVar147 = auVar98._4_4_;
      fVar194 = auVar98._8_4_;
      fVar171 = auVar98._12_4_;
      fVar193 = auVar199._0_4_;
      fVar169 = auVar199._4_4_;
      fVar148 = auVar199._8_4_;
      fVar195 = auVar199._12_4_;
      auVar133._0_4_ = auVar250._0_4_ * fVar166 + fVar87 * fVar193;
      auVar133._4_4_ = auVar250._4_4_ * fVar147 + fVar110 * fVar169;
      auVar133._8_4_ = auVar250._0_4_ * fVar194 + fVar87 * fVar148;
      auVar133._12_4_ = auVar250._4_4_ * fVar171 + fVar110 * fVar195;
      auVar156._0_4_ = auVar221._0_4_ * fVar166 + fVar88 * fVar193;
      auVar156._4_4_ = auVar221._4_4_ * fVar147 + fVar111 * fVar169;
      auVar156._8_4_ = auVar221._0_4_ * fVar194 + fVar88 * fVar148;
      auVar156._12_4_ = auVar221._4_4_ * fVar171 + fVar111 * fVar195;
      auVar184._0_4_ = auVar92._0_4_ * fVar166 + auVar298._0_4_ * fVar193;
      auVar184._4_4_ = auVar92._4_4_ * fVar147 + auVar298._4_4_ * fVar169;
      auVar184._8_4_ = auVar92._0_4_ * fVar194 + auVar298._0_4_ * fVar148;
      auVar184._12_4_ = auVar92._4_4_ * fVar171 + auVar298._4_4_ * fVar195;
      auVar94._0_4_ = auVar76._0_4_ * fVar166 + fVar193 * (float)local_4a0._0_4_;
      auVar94._4_4_ = auVar76._4_4_ * fVar147 + fVar169 * (float)local_4a0._4_4_;
      auVar94._8_4_ = auVar76._0_4_ * fVar194 + fVar148 * fStack_498;
      auVar94._12_4_ = auVar76._4_4_ * fVar171 + fVar195 * fStack_494;
      auVar124._16_16_ = auVar133;
      auVar124._0_16_ = auVar133;
      auVar143._16_16_ = auVar156;
      auVar143._0_16_ = auVar156;
      auVar165._16_16_ = auVar184;
      auVar165._0_16_ = auVar184;
      auVar81 = vshufps_avx(ZEXT2032(CONCAT416(fVar149,ZEXT416((uint)fVar146))),
                            ZEXT2032(CONCAT416(fVar149,ZEXT416((uint)fVar146))),0);
      auVar18 = vsubps_avx(auVar143,auVar124);
      fVar166 = auVar81._0_4_;
      fVar193 = auVar81._4_4_;
      fVar147 = auVar81._8_4_;
      fVar169 = auVar81._12_4_;
      fVar194 = auVar81._16_4_;
      fVar148 = auVar81._20_4_;
      fVar171 = auVar81._24_4_;
      auVar125._0_4_ = auVar133._0_4_ + auVar18._0_4_ * fVar166;
      auVar125._4_4_ = auVar133._4_4_ + auVar18._4_4_ * fVar193;
      auVar125._8_4_ = auVar133._8_4_ + auVar18._8_4_ * fVar147;
      auVar125._12_4_ = auVar133._12_4_ + auVar18._12_4_ * fVar169;
      auVar125._16_4_ = auVar133._0_4_ + auVar18._16_4_ * fVar194;
      auVar125._20_4_ = auVar133._4_4_ + auVar18._20_4_ * fVar148;
      auVar125._24_4_ = auVar133._8_4_ + auVar18._24_4_ * fVar171;
      auVar125._28_4_ = auVar133._12_4_ + auVar18._28_4_;
      auVar18 = vsubps_avx(auVar165,auVar143);
      auVar144._0_4_ = auVar156._0_4_ + auVar18._0_4_ * fVar166;
      auVar144._4_4_ = auVar156._4_4_ + auVar18._4_4_ * fVar193;
      auVar144._8_4_ = auVar156._8_4_ + auVar18._8_4_ * fVar147;
      auVar144._12_4_ = auVar156._12_4_ + auVar18._12_4_ * fVar169;
      auVar144._16_4_ = auVar156._0_4_ + auVar18._16_4_ * fVar194;
      auVar144._20_4_ = auVar156._4_4_ + auVar18._20_4_ * fVar148;
      auVar144._24_4_ = auVar156._8_4_ + auVar18._24_4_ * fVar171;
      auVar144._28_4_ = auVar156._12_4_ + auVar18._28_4_;
      auVar98 = vsubps_avx(auVar94,auVar184);
      auVar107._0_4_ = auVar184._0_4_ + auVar98._0_4_ * fVar166;
      auVar107._4_4_ = auVar184._4_4_ + auVar98._4_4_ * fVar193;
      auVar107._8_4_ = auVar184._8_4_ + auVar98._8_4_ * fVar147;
      auVar107._12_4_ = auVar184._12_4_ + auVar98._12_4_ * fVar169;
      auVar107._16_4_ = auVar184._0_4_ + auVar98._0_4_ * fVar194;
      auVar107._20_4_ = auVar184._4_4_ + auVar98._4_4_ * fVar148;
      auVar107._24_4_ = auVar184._8_4_ + auVar98._8_4_ * fVar171;
      auVar107._28_4_ = auVar184._12_4_ + auVar98._12_4_;
      auVar18 = vsubps_avx(auVar144,auVar125);
      auVar126._0_4_ = auVar125._0_4_ + fVar166 * auVar18._0_4_;
      auVar126._4_4_ = auVar125._4_4_ + fVar193 * auVar18._4_4_;
      auVar126._8_4_ = auVar125._8_4_ + fVar147 * auVar18._8_4_;
      auVar126._12_4_ = auVar125._12_4_ + fVar169 * auVar18._12_4_;
      auVar126._16_4_ = auVar125._16_4_ + fVar194 * auVar18._16_4_;
      auVar126._20_4_ = auVar125._20_4_ + fVar148 * auVar18._20_4_;
      auVar126._24_4_ = auVar125._24_4_ + fVar171 * auVar18._24_4_;
      auVar126._28_4_ = auVar125._28_4_ + auVar18._28_4_;
      auVar18 = vsubps_avx(auVar107,auVar144);
      auVar108._0_4_ = auVar144._0_4_ + fVar166 * auVar18._0_4_;
      auVar108._4_4_ = auVar144._4_4_ + fVar193 * auVar18._4_4_;
      auVar108._8_4_ = auVar144._8_4_ + fVar147 * auVar18._8_4_;
      auVar108._12_4_ = auVar144._12_4_ + fVar169 * auVar18._12_4_;
      auVar108._16_4_ = auVar144._16_4_ + fVar194 * auVar18._16_4_;
      auVar108._20_4_ = auVar144._20_4_ + fVar148 * auVar18._20_4_;
      auVar108._24_4_ = auVar144._24_4_ + fVar171 * auVar18._24_4_;
      auVar108._28_4_ = auVar144._28_4_ + auVar18._28_4_;
      auVar18 = vsubps_avx(auVar108,auVar126);
      auVar134._0_4_ = auVar126._0_4_ + fVar166 * auVar18._0_4_;
      auVar134._4_4_ = auVar126._4_4_ + fVar193 * auVar18._4_4_;
      auVar134._8_4_ = auVar126._8_4_ + fVar147 * auVar18._8_4_;
      auVar134._12_4_ = auVar126._12_4_ + fVar169 * auVar18._12_4_;
      auVar145._16_4_ = auVar126._16_4_ + fVar194 * auVar18._16_4_;
      auVar145._0_16_ = auVar134;
      auVar145._20_4_ = auVar126._20_4_ + fVar148 * auVar18._20_4_;
      auVar145._24_4_ = auVar126._24_4_ + fVar171 * auVar18._24_4_;
      auVar145._28_4_ = auVar126._28_4_ + auVar144._28_4_;
      fVar166 = auVar18._4_4_ * 3.0;
      auVar117 = auVar145._16_16_;
      auVar97 = vshufps_avx(ZEXT416((uint)(fVar174 * 0.33333334)),
                            ZEXT416((uint)(fVar174 * 0.33333334)),0);
      auVar238._0_4_ = auVar134._0_4_ + auVar97._0_4_ * auVar18._0_4_ * 3.0;
      auVar238._4_4_ = auVar134._4_4_ + auVar97._4_4_ * fVar166;
      auVar238._8_4_ = auVar134._8_4_ + auVar97._8_4_ * auVar18._8_4_ * 3.0;
      auVar238._12_4_ = auVar134._12_4_ + auVar97._12_4_ * auVar18._12_4_ * 3.0;
      auVar191 = vshufpd_avx(auVar134,auVar134,3);
      auVar75 = vshufpd_avx(auVar117,auVar117,3);
      auVar98 = vsubps_avx(auVar191,auVar134);
      auVar199 = vsubps_avx(auVar75,auVar117);
      auVar95._0_4_ = auVar98._0_4_ + auVar199._0_4_;
      auVar95._4_4_ = auVar98._4_4_ + auVar199._4_4_;
      auVar95._8_4_ = auVar98._8_4_ + auVar199._8_4_;
      auVar95._12_4_ = auVar98._12_4_ + auVar199._12_4_;
      auVar98 = vmovshdup_avx(auVar134);
      auVar199 = vmovshdup_avx(auVar238);
      auVar90 = vshufps_avx(auVar95,auVar95,0);
      auVar78 = vshufps_avx(auVar95,auVar95,0x55);
      fVar148 = auVar78._0_4_;
      fVar171 = auVar78._4_4_;
      fVar195 = auVar78._8_4_;
      fVar128 = auVar78._12_4_;
      fVar193 = auVar90._0_4_;
      fVar147 = auVar90._4_4_;
      fVar169 = auVar90._8_4_;
      fVar194 = auVar90._12_4_;
      auVar222._0_4_ = fVar193 * auVar134._0_4_ + fVar148 * auVar98._0_4_;
      auVar222._4_4_ = fVar147 * auVar134._4_4_ + fVar171 * auVar98._4_4_;
      auVar222._8_4_ = fVar169 * auVar134._8_4_ + fVar195 * auVar98._8_4_;
      auVar222._12_4_ = fVar194 * auVar134._12_4_ + fVar128 * auVar98._12_4_;
      auVar239._0_4_ = auVar238._0_4_ * fVar193 + fVar148 * auVar199._0_4_;
      auVar239._4_4_ = auVar238._4_4_ * fVar147 + fVar171 * auVar199._4_4_;
      auVar239._8_4_ = auVar238._8_4_ * fVar169 + fVar195 * auVar199._8_4_;
      auVar239._12_4_ = auVar238._12_4_ * fVar194 + fVar128 * auVar199._12_4_;
      auVar199 = vshufps_avx(auVar222,auVar222,0xe8);
      auVar90 = vshufps_avx(auVar239,auVar239,0xe8);
      auVar98 = vcmpps_avx(auVar199,auVar90,1);
      uVar71 = vextractps_avx(auVar98,0);
      auVar78 = auVar239;
      if ((uVar71 & 1) == 0) {
        auVar78 = auVar222;
      }
      auVar96._0_4_ = auVar97._0_4_ * auVar18._16_4_ * 3.0;
      auVar96._4_4_ = auVar97._4_4_ * fVar166;
      auVar96._8_4_ = auVar97._8_4_ * auVar18._24_4_ * 3.0;
      auVar96._12_4_ = auVar97._12_4_ * auVar81._28_4_;
      auVar89 = vsubps_avx(auVar117,auVar96);
      auVar97 = vmovshdup_avx(auVar89);
      auVar117 = vmovshdup_avx(auVar117);
      fVar166 = auVar89._0_4_;
      fVar247 = auVar89._4_4_;
      auVar305._0_4_ = fVar193 * fVar166 + fVar148 * auVar97._0_4_;
      auVar305._4_4_ = fVar147 * fVar247 + fVar171 * auVar97._4_4_;
      auVar305._8_4_ = fVar169 * auVar89._8_4_ + fVar195 * auVar97._8_4_;
      auVar305._12_4_ = fVar194 * auVar89._12_4_ + fVar128 * auVar97._12_4_;
      auVar290._0_4_ = fVar193 * auVar145._16_4_ + fVar148 * auVar117._0_4_;
      auVar290._4_4_ = fVar147 * auVar145._20_4_ + fVar171 * auVar117._4_4_;
      auVar290._8_4_ = fVar169 * auVar145._24_4_ + fVar195 * auVar117._8_4_;
      auVar290._12_4_ = fVar194 * auVar145._28_4_ + fVar128 * auVar117._12_4_;
      auVar117 = vshufps_avx(auVar305,auVar305,0xe8);
      auVar112 = vshufps_avx(auVar290,auVar290,0xe8);
      auVar97 = vcmpps_avx(auVar117,auVar112,1);
      uVar71 = vextractps_avx(auVar97,0);
      auVar113 = auVar290;
      if ((uVar71 & 1) == 0) {
        auVar113 = auVar305;
      }
      auVar78 = vmaxss_avx(auVar113,auVar78);
      auVar199 = vminps_avx(auVar199,auVar90);
      auVar90 = vminps_avx(auVar117,auVar112);
      auVar90 = vminps_avx(auVar199,auVar90);
      auVar98 = vshufps_avx(auVar98,auVar98,0x55);
      auVar98 = vblendps_avx(auVar98,auVar97,2);
      auVar97 = vpslld_avx(auVar98,0x1f);
      auVar98 = vshufpd_avx(auVar239,auVar239,1);
      auVar98 = vinsertps_avx(auVar98,auVar290,0x9c);
      auVar199 = vshufpd_avx(auVar222,auVar222,1);
      auVar199 = vinsertps_avx(auVar199,auVar305,0x9c);
      auVar98 = vblendvps_avx(auVar199,auVar98,auVar97);
      auVar199 = vmovshdup_avx(auVar98);
      auVar98 = vmaxss_avx(auVar199,auVar98);
      fVar169 = auVar90._0_4_;
      auVar199 = vmovshdup_avx(auVar90);
      fVar147 = auVar98._0_4_;
      fVar194 = auVar199._0_4_;
      fVar193 = auVar78._0_4_;
      if ((0.0001 <= fVar169) || (fVar147 <= -0.0001)) {
        if ((-0.0001 < fVar193 && fVar194 < 0.0001) ||
           ((fVar169 < 0.0001 && -0.0001 < fVar193 || (fVar194 < 0.0001 && -0.0001 < fVar147))))
        goto LAB_00f165d9;
LAB_00f171e2:
        auVar309 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
LAB_00f171eb:
        bVar50 = true;
      }
      else {
LAB_00f165d9:
        auVar97 = vcmpps_avx(auVar90,ZEXT416(0) << 0x20,1);
        auVar199 = vcmpss_avx(auVar78,ZEXT416(0),1);
        auVar299._8_4_ = 0x3f800000;
        auVar299._0_8_ = &DAT_3f8000003f800000;
        auVar299._12_4_ = 0x3f800000;
        auVar185._8_4_ = 0xbf800000;
        auVar185._0_8_ = 0xbf800000bf800000;
        auVar185._12_4_ = 0xbf800000;
        auVar199 = vblendvps_avx(auVar299,auVar185,auVar199);
        auVar97 = vblendvps_avx(auVar299,auVar185,auVar97);
        auVar117 = vcmpss_avx(auVar199,auVar97,4);
        auVar117 = vpshufd_avx(ZEXT416(auVar117._0_4_ & 1),0x50);
        auVar117 = vpslld_avx(auVar117,0x1f);
        auVar117 = vpsrad_avx(auVar117,0x1f);
        auVar117 = vpandn_avx(auVar117,_DAT_02020eb0);
        auVar112 = vmovshdup_avx(auVar97);
        fVar148 = auVar112._0_4_;
        if ((auVar97._0_4_ != fVar148) || (NAN(auVar97._0_4_) || NAN(fVar148))) {
          if ((fVar194 != fVar169) || (NAN(fVar194) || NAN(fVar169))) {
            fVar169 = -fVar169 / (fVar194 - fVar169);
            auVar97 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar169) * 0.0 + fVar169)));
          }
          else {
            auVar97 = vcmpss_avx(auVar90,ZEXT416(0),0);
            auVar97 = vpshufd_avx(ZEXT416(auVar97._0_4_ & 1),0x50);
            auVar97 = vpslld_avx(auVar97,0x1f);
            auVar97 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar97);
          }
          auVar112 = vcmpps_avx(auVar117,auVar97,1);
          auVar90 = vblendps_avx(auVar117,auVar97,2);
          auVar97 = vblendps_avx(auVar97,auVar117,2);
          auVar117 = vblendvps_avx(auVar97,auVar90,auVar112);
        }
        auVar98 = vcmpss_avx(auVar98,ZEXT416(0),1);
        auVar118._8_4_ = 0xbf800000;
        auVar118._0_8_ = 0xbf800000bf800000;
        auVar118._12_4_ = 0xbf800000;
        auVar98 = vblendvps_avx(auVar299,auVar118,auVar98);
        fVar169 = auVar98._0_4_;
        if ((auVar199._0_4_ != fVar169) || (NAN(auVar199._0_4_) || NAN(fVar169))) {
          if ((fVar147 != fVar193) || (NAN(fVar147) || NAN(fVar193))) {
            fVar193 = -fVar193 / (fVar147 - fVar193);
            auVar98 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar193) * 0.0 + fVar193)));
          }
          else {
            auVar98 = vcmpss_avx(auVar78,ZEXT416(0),0);
            auVar98 = vpshufd_avx(ZEXT416(auVar98._0_4_ & 1),0x50);
            auVar98 = vpslld_avx(auVar98,0x1f);
            auVar98 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar98);
          }
          auVar97 = vcmpps_avx(auVar117,auVar98,1);
          auVar199 = vblendps_avx(auVar117,auVar98,2);
          auVar98 = vblendps_avx(auVar98,auVar117,2);
          auVar117 = vblendvps_avx(auVar98,auVar199,auVar97);
        }
        if ((fVar148 != fVar169) || (NAN(fVar148) || NAN(fVar169))) {
          auVar98 = vcmpps_avx(auVar117,auVar299,1);
          auVar199 = vinsertps_avx(auVar117,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar186._4_12_ = auVar117._4_12_;
          auVar186._0_4_ = 0x3f800000;
          auVar117 = vblendvps_avx(auVar186,auVar199,auVar98);
        }
        auVar98 = vcmpps_avx(auVar117,_DAT_01fec6f0,1);
        auVar53._12_4_ = 0;
        auVar53._0_12_ = auVar117._4_12_;
        auVar199 = vinsertps_avx(auVar117,ZEXT416(0x3f800000),0x10);
        auVar98 = vblendvps_avx(auVar199,auVar53 << 0x20,auVar98);
        auVar199 = vmovshdup_avx(auVar98);
        bVar50 = true;
        if (auVar98._0_4_ <= auVar199._0_4_) {
          auVar99._0_4_ = auVar98._0_4_ + -0.1;
          auVar99._4_4_ = auVar98._4_4_ + 0.1;
          auVar99._8_4_ = auVar98._8_4_ + 0.0;
          auVar99._12_4_ = auVar98._12_4_ + 0.0;
          auVar97 = vshufpd_avx(auVar238,auVar238,3);
          auVar135._8_8_ = 0x3f80000000000000;
          auVar135._0_8_ = 0x3f80000000000000;
          auVar98 = vcmpps_avx(auVar99,auVar135,1);
          auVar54._12_4_ = 0;
          auVar54._0_12_ = auVar99._4_12_;
          auVar199 = vinsertps_avx(auVar99,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar98 = vblendvps_avx(auVar199,auVar54 << 0x20,auVar98);
          auVar199 = vshufpd_avx(auVar89,auVar89,3);
          auVar90 = vshufps_avx(auVar98,auVar98,0x50);
          auVar78 = vsubps_avx(auVar299,auVar90);
          local_5c0 = auVar191._0_4_;
          fStack_5bc = auVar191._4_4_;
          fStack_5b8 = auVar191._8_4_;
          fStack_5b4 = auVar191._12_4_;
          fVar193 = auVar90._0_4_;
          fVar147 = auVar90._4_4_;
          fVar169 = auVar90._8_4_;
          fVar194 = auVar90._12_4_;
          local_600 = auVar75._0_4_;
          fStack_5fc = auVar75._4_4_;
          fStack_5f8 = auVar75._8_4_;
          fStack_5f4 = auVar75._12_4_;
          fVar148 = auVar78._0_4_;
          fVar171 = auVar78._4_4_;
          fVar195 = auVar78._8_4_;
          fVar128 = auVar78._12_4_;
          auVar119._0_4_ = fVar193 * local_5c0 + fVar148 * auVar134._0_4_;
          auVar119._4_4_ = fVar147 * fStack_5bc + fVar171 * auVar134._4_4_;
          auVar119._8_4_ = fVar169 * fStack_5b8 + fVar195 * auVar134._0_4_;
          auVar119._12_4_ = fVar194 * fStack_5b4 + fVar128 * auVar134._4_4_;
          auVar157._0_4_ = fVar193 * auVar97._0_4_ + fVar148 * auVar238._0_4_;
          auVar157._4_4_ = fVar147 * auVar97._4_4_ + fVar171 * auVar238._4_4_;
          auVar157._8_4_ = fVar169 * auVar97._8_4_ + fVar195 * auVar238._0_4_;
          auVar157._12_4_ = fVar194 * auVar97._12_4_ + fVar128 * auVar238._4_4_;
          auVar214._0_4_ = fVar193 * auVar199._0_4_ + fVar148 * fVar166;
          auVar214._4_4_ = fVar147 * auVar199._4_4_ + fVar171 * fVar247;
          auVar214._8_4_ = fVar169 * auVar199._8_4_ + fVar195 * fVar166;
          auVar214._12_4_ = fVar194 * auVar199._12_4_ + fVar128 * fVar247;
          auVar223._0_4_ = fVar193 * local_600 + fVar148 * auVar145._16_4_;
          auVar223._4_4_ = fVar147 * fStack_5fc + fVar171 * auVar145._20_4_;
          auVar223._8_4_ = fVar169 * fStack_5f8 + fVar195 * auVar145._16_4_;
          auVar223._12_4_ = fVar194 * fStack_5f4 + fVar128 * auVar145._20_4_;
          auVar75 = vsubps_avx(auVar299,auVar98);
          auVar199 = vmovshdup_avx(local_6b0);
          auVar191 = vmovsldup_avx(local_6b0);
          local_6b0._0_4_ = auVar75._0_4_ * auVar191._0_4_ + auVar199._0_4_ * auVar98._0_4_;
          local_6b0._4_4_ = auVar75._4_4_ * auVar191._4_4_ + auVar199._4_4_ * auVar98._4_4_;
          local_6b0._8_4_ = auVar75._8_4_ * auVar191._8_4_ + auVar199._8_4_ * auVar98._8_4_;
          local_6b0._12_4_ = auVar75._12_4_ * auVar191._12_4_ + auVar199._12_4_ * auVar98._12_4_;
          auVar89 = vmovshdup_avx(local_6b0);
          auVar98 = vsubps_avx(auVar157,auVar119);
          auVar187._0_4_ = auVar98._0_4_ * 3.0;
          auVar187._4_4_ = auVar98._4_4_ * 3.0;
          auVar187._8_4_ = auVar98._8_4_ * 3.0;
          auVar187._12_4_ = auVar98._12_4_ * 3.0;
          auVar98 = vsubps_avx(auVar214,auVar157);
          auVar201._0_4_ = auVar98._0_4_ * 3.0;
          auVar201._4_4_ = auVar98._4_4_ * 3.0;
          auVar201._8_4_ = auVar98._8_4_ * 3.0;
          auVar201._12_4_ = auVar98._12_4_ * 3.0;
          auVar98 = vsubps_avx(auVar223,auVar214);
          auVar240._0_4_ = auVar98._0_4_ * 3.0;
          auVar240._4_4_ = auVar98._4_4_ * 3.0;
          auVar240._8_4_ = auVar98._8_4_ * 3.0;
          auVar240._12_4_ = auVar98._12_4_ * 3.0;
          auVar199 = vminps_avx(auVar201,auVar240);
          auVar98 = vmaxps_avx(auVar201,auVar240);
          auVar199 = vminps_avx(auVar187,auVar199);
          auVar98 = vmaxps_avx(auVar187,auVar98);
          auVar191 = vshufpd_avx(auVar199,auVar199,3);
          auVar75 = vshufpd_avx(auVar98,auVar98,3);
          auVar199 = vminps_avx(auVar199,auVar191);
          auVar98 = vmaxps_avx(auVar98,auVar75);
          auVar191 = vshufps_avx(ZEXT416((uint)(1.0 / fVar174)),ZEXT416((uint)(1.0 / fVar174)),0);
          auVar188._0_4_ = auVar191._0_4_ * auVar199._0_4_;
          auVar188._4_4_ = auVar191._4_4_ * auVar199._4_4_;
          auVar188._8_4_ = auVar191._8_4_ * auVar199._8_4_;
          auVar188._12_4_ = auVar191._12_4_ * auVar199._12_4_;
          auVar202._0_4_ = auVar98._0_4_ * auVar191._0_4_;
          auVar202._4_4_ = auVar98._4_4_ * auVar191._4_4_;
          auVar202._8_4_ = auVar98._8_4_ * auVar191._8_4_;
          auVar202._12_4_ = auVar98._12_4_ * auVar191._12_4_;
          auVar78 = ZEXT416((uint)(1.0 / (auVar89._0_4_ - local_6b0._0_4_)));
          auVar98 = vshufpd_avx(auVar119,auVar119,3);
          auVar199 = vshufpd_avx(auVar157,auVar157,3);
          auVar191 = vshufpd_avx(auVar214,auVar214,3);
          auVar75 = vshufpd_avx(auVar223,auVar223,3);
          auVar98 = vsubps_avx(auVar98,auVar119);
          auVar97 = vsubps_avx(auVar199,auVar157);
          auVar90 = vsubps_avx(auVar191,auVar214);
          auVar75 = vsubps_avx(auVar75,auVar223);
          auVar199 = vminps_avx(auVar98,auVar97);
          auVar98 = vmaxps_avx(auVar98,auVar97);
          auVar191 = vminps_avx(auVar90,auVar75);
          auVar191 = vminps_avx(auVar199,auVar191);
          auVar199 = vmaxps_avx(auVar90,auVar75);
          auVar98 = vmaxps_avx(auVar98,auVar199);
          auVar199 = vshufps_avx(auVar78,auVar78,0);
          auVar251._0_4_ = auVar199._0_4_ * auVar191._0_4_;
          auVar251._4_4_ = auVar199._4_4_ * auVar191._4_4_;
          auVar251._8_4_ = auVar199._8_4_ * auVar191._8_4_;
          auVar251._12_4_ = auVar199._12_4_ * auVar191._12_4_;
          auVar261._0_4_ = auVar199._0_4_ * auVar98._0_4_;
          auVar261._4_4_ = auVar199._4_4_ * auVar98._4_4_;
          auVar261._8_4_ = auVar199._8_4_ * auVar98._8_4_;
          auVar261._12_4_ = auVar199._12_4_ * auVar98._12_4_;
          auVar98 = vmovsldup_avx(local_6b0);
          auVar215._4_12_ = auVar98._4_12_;
          auVar215._0_4_ = fVar146;
          auVar224._4_12_ = local_6b0._4_12_;
          auVar224._0_4_ = fVar149;
          auVar79._0_4_ = (fVar149 + fVar146) * 0.5;
          auVar79._4_4_ = (local_6b0._4_4_ + auVar98._4_4_) * 0.5;
          auVar79._8_4_ = (local_6b0._8_4_ + auVar98._8_4_) * 0.5;
          auVar79._12_4_ = (local_6b0._12_4_ + auVar98._12_4_) * 0.5;
          auVar98 = vshufps_avx(auVar79,auVar79,0);
          fVar166 = auVar98._0_4_;
          fVar193 = auVar98._4_4_;
          fVar147 = auVar98._8_4_;
          fVar169 = auVar98._12_4_;
          local_690 = auVar12._0_4_;
          fStack_68c = auVar12._4_4_;
          fStack_688 = auVar12._8_4_;
          fStack_684 = auVar12._12_4_;
          auVar158._0_4_ = fVar166 * (float)local_330._0_4_ + local_690;
          auVar158._4_4_ = fVar193 * (float)local_330._4_4_ + fStack_68c;
          auVar158._8_4_ = fVar147 * fStack_328 + fStack_688;
          auVar158._12_4_ = fVar169 * fStack_324 + fStack_684;
          local_620._0_4_ = auVar260._0_4_;
          local_620._4_4_ = auVar260._4_4_;
          fStack_618 = auVar260._8_4_;
          fStack_614 = auVar260._12_4_;
          auVar241._0_4_ = fVar166 * (float)local_340._0_4_ + (float)local_620._0_4_;
          auVar241._4_4_ = fVar193 * (float)local_340._4_4_ + (float)local_620._4_4_;
          auVar241._8_4_ = fVar147 * fStack_338 + fStack_618;
          auVar241._12_4_ = fVar169 * fStack_334 + fStack_614;
          local_560 = auVar13._0_4_;
          fStack_55c = auVar13._4_4_;
          fStack_558 = auVar13._8_4_;
          fStack_554 = auVar13._12_4_;
          auVar275._0_4_ = fVar166 * (float)local_350._0_4_ + local_560;
          auVar275._4_4_ = fVar193 * (float)local_350._4_4_ + fStack_55c;
          auVar275._8_4_ = fVar147 * fStack_348 + fStack_558;
          auVar275._12_4_ = fVar169 * fStack_344 + fStack_554;
          auVar98 = vsubps_avx(auVar241,auVar158);
          auVar159._0_4_ = auVar98._0_4_ * fVar166 + auVar158._0_4_;
          auVar159._4_4_ = auVar98._4_4_ * fVar193 + auVar158._4_4_;
          auVar159._8_4_ = auVar98._8_4_ * fVar147 + auVar158._8_4_;
          auVar159._12_4_ = auVar98._12_4_ * fVar169 + auVar158._12_4_;
          auVar98 = vsubps_avx(auVar275,auVar241);
          auVar242._0_4_ = auVar241._0_4_ + auVar98._0_4_ * fVar166;
          auVar242._4_4_ = auVar241._4_4_ + auVar98._4_4_ * fVar193;
          auVar242._8_4_ = auVar241._8_4_ + auVar98._8_4_ * fVar147;
          auVar242._12_4_ = auVar241._12_4_ + auVar98._12_4_ * fVar169;
          auVar98 = vsubps_avx(auVar242,auVar159);
          fVar166 = auVar159._0_4_ + auVar98._0_4_ * fVar166;
          fVar193 = auVar159._4_4_ + auVar98._4_4_ * fVar193;
          auVar120._0_8_ = CONCAT44(fVar193,fVar166);
          auVar120._8_4_ = auVar159._8_4_ + auVar98._8_4_ * fVar147;
          auVar120._12_4_ = auVar159._12_4_ + auVar98._12_4_ * fVar169;
          fVar147 = auVar98._0_4_ * 3.0;
          fVar169 = auVar98._4_4_ * 3.0;
          auVar160._0_8_ = CONCAT44(fVar169,fVar147);
          auVar160._8_4_ = auVar98._8_4_ * 3.0;
          auVar160._12_4_ = auVar98._12_4_ * 3.0;
          auVar243._8_8_ = auVar120._0_8_;
          auVar243._0_8_ = auVar120._0_8_;
          auVar98 = vshufpd_avx(auVar120,auVar120,3);
          auVar199 = vshufps_avx(auVar79,auVar79,0x55);
          auVar90 = vsubps_avx(auVar98,auVar243);
          auVar244._0_4_ = auVar199._0_4_ * auVar90._0_4_ + fVar166;
          auVar244._4_4_ = auVar199._4_4_ * auVar90._4_4_ + fVar193;
          auVar244._8_4_ = auVar199._8_4_ * auVar90._8_4_ + fVar166;
          auVar244._12_4_ = auVar199._12_4_ * auVar90._12_4_ + fVar193;
          auVar291._8_8_ = auVar160._0_8_;
          auVar291._0_8_ = auVar160._0_8_;
          auVar98 = vshufpd_avx(auVar160,auVar160,1);
          auVar98 = vsubps_avx(auVar98,auVar291);
          auVar161._0_4_ = fVar147 + auVar199._0_4_ * auVar98._0_4_;
          auVar161._4_4_ = fVar169 + auVar199._4_4_ * auVar98._4_4_;
          auVar161._8_4_ = fVar147 + auVar199._8_4_ * auVar98._8_4_;
          auVar161._12_4_ = fVar169 + auVar199._12_4_ * auVar98._12_4_;
          auVar199 = vmovshdup_avx(auVar161);
          auVar292._0_8_ = auVar199._0_8_ ^ 0x8000000080000000;
          auVar292._8_4_ = auVar199._8_4_ ^ 0x80000000;
          auVar292._12_4_ = auVar199._12_4_ ^ 0x80000000;
          auVar191 = vmovshdup_avx(auVar90);
          auVar98 = vunpcklps_avx(auVar191,auVar292);
          auVar75 = vshufps_avx(auVar98,auVar292,4);
          auVar121._0_8_ = auVar90._0_8_ ^ 0x8000000080000000;
          auVar121._8_4_ = -auVar90._8_4_;
          auVar121._12_4_ = -auVar90._12_4_;
          auVar98 = vmovlhps_avx(auVar121,auVar161);
          auVar97 = vshufps_avx(auVar98,auVar161,8);
          auVar98 = ZEXT416((uint)(auVar191._0_4_ * auVar161._0_4_ - auVar199._0_4_ * auVar90._0_4_)
                           );
          auVar199 = vshufps_avx(auVar98,auVar98,0);
          auVar98 = vdivps_avx(auVar75,auVar199);
          auVar199 = vdivps_avx(auVar97,auVar199);
          auVar97 = vinsertps_avx(auVar188,auVar251,0x1c);
          auVar90 = vinsertps_avx(auVar202,auVar261,0x1c);
          auVar78 = vinsertps_avx(auVar251,auVar188,0x4c);
          auVar117 = vinsertps_avx(auVar261,auVar202,0x4c);
          auVar191 = vmovsldup_avx(auVar98);
          auVar262._0_4_ = auVar191._0_4_ * auVar97._0_4_;
          auVar262._4_4_ = auVar191._4_4_ * auVar97._4_4_;
          auVar262._8_4_ = auVar191._8_4_ * auVar97._8_4_;
          auVar262._12_4_ = auVar191._12_4_ * auVar97._12_4_;
          auVar252._0_4_ = auVar191._0_4_ * auVar90._0_4_;
          auVar252._4_4_ = auVar191._4_4_ * auVar90._4_4_;
          auVar252._8_4_ = auVar191._8_4_ * auVar90._8_4_;
          auVar252._12_4_ = auVar191._12_4_ * auVar90._12_4_;
          auVar75 = vminps_avx(auVar262,auVar252);
          auVar191 = vmaxps_avx(auVar252,auVar262);
          auVar112 = vmovsldup_avx(auVar199);
          auVar306._0_4_ = auVar112._0_4_ * auVar78._0_4_;
          auVar306._4_4_ = auVar112._4_4_ * auVar78._4_4_;
          auVar306._8_4_ = auVar112._8_4_ * auVar78._8_4_;
          auVar306._12_4_ = auVar112._12_4_ * auVar78._12_4_;
          auVar253._0_4_ = auVar112._0_4_ * auVar117._0_4_;
          auVar253._4_4_ = auVar112._4_4_ * auVar117._4_4_;
          auVar253._8_4_ = auVar112._8_4_ * auVar117._8_4_;
          auVar253._12_4_ = auVar112._12_4_ * auVar117._12_4_;
          auVar112 = vminps_avx(auVar306,auVar253);
          auVar100._0_4_ = auVar75._0_4_ + auVar112._0_4_;
          auVar100._4_4_ = auVar75._4_4_ + auVar112._4_4_;
          auVar100._8_4_ = auVar75._8_4_ + auVar112._8_4_;
          auVar100._12_4_ = auVar75._12_4_ + auVar112._12_4_;
          auVar75 = vmaxps_avx(auVar253,auVar306);
          auVar112 = vsubps_avx(auVar215,auVar79);
          auVar113 = vsubps_avx(auVar224,auVar79);
          auVar225._0_4_ = auVar191._0_4_ + auVar75._0_4_;
          auVar225._4_4_ = auVar191._4_4_ + auVar75._4_4_;
          auVar225._8_4_ = auVar191._8_4_ + auVar75._8_4_;
          auVar225._12_4_ = auVar191._12_4_ + auVar75._12_4_;
          auVar263._8_8_ = 0x3f800000;
          auVar263._0_8_ = 0x3f800000;
          auVar191 = vsubps_avx(auVar263,auVar225);
          auVar75 = vsubps_avx(auVar263,auVar100);
          fVar171 = auVar112._0_4_;
          auVar264._0_4_ = fVar171 * auVar191._0_4_;
          fVar195 = auVar112._4_4_;
          auVar264._4_4_ = fVar195 * auVar191._4_4_;
          fVar128 = auVar112._8_4_;
          auVar264._8_4_ = fVar128 * auVar191._8_4_;
          fVar247 = auVar112._12_4_;
          auVar264._12_4_ = fVar247 * auVar191._12_4_;
          fVar147 = auVar113._0_4_;
          auVar226._0_4_ = auVar191._0_4_ * fVar147;
          fVar169 = auVar113._4_4_;
          auVar226._4_4_ = auVar191._4_4_ * fVar169;
          fVar194 = auVar113._8_4_;
          auVar226._8_4_ = auVar191._8_4_ * fVar194;
          fVar148 = auVar113._12_4_;
          auVar226._12_4_ = auVar191._12_4_ * fVar148;
          auVar300._0_4_ = fVar171 * auVar75._0_4_;
          auVar300._4_4_ = fVar195 * auVar75._4_4_;
          auVar300._8_4_ = fVar128 * auVar75._8_4_;
          auVar300._12_4_ = fVar247 * auVar75._12_4_;
          auVar101._0_4_ = fVar147 * auVar75._0_4_;
          auVar101._4_4_ = fVar169 * auVar75._4_4_;
          auVar101._8_4_ = fVar194 * auVar75._8_4_;
          auVar101._12_4_ = fVar148 * auVar75._12_4_;
          auVar191 = vminps_avx(auVar264,auVar300);
          auVar75 = vminps_avx(auVar226,auVar101);
          auVar112 = vminps_avx(auVar191,auVar75);
          auVar191 = vmaxps_avx(auVar300,auVar264);
          auVar75 = vmaxps_avx(auVar101,auVar226);
          auVar113 = vshufps_avx(auVar79,auVar79,0x54);
          auVar75 = vmaxps_avx(auVar75,auVar191);
          auVar130 = vshufps_avx(auVar244,auVar244,0);
          auVar131 = vshufps_avx(auVar244,auVar244,0x55);
          auVar191 = vhaddps_avx(auVar112,auVar112);
          auVar75 = vhaddps_avx(auVar75,auVar75);
          auVar227._0_4_ = auVar130._0_4_ * auVar98._0_4_ + auVar131._0_4_ * auVar199._0_4_;
          auVar227._4_4_ = auVar130._4_4_ * auVar98._4_4_ + auVar131._4_4_ * auVar199._4_4_;
          auVar227._8_4_ = auVar130._8_4_ * auVar98._8_4_ + auVar131._8_4_ * auVar199._8_4_;
          auVar227._12_4_ = auVar130._12_4_ * auVar98._12_4_ + auVar131._12_4_ * auVar199._12_4_;
          auVar112 = vsubps_avx(auVar113,auVar227);
          fVar166 = auVar112._0_4_ + auVar191._0_4_;
          fVar193 = auVar112._0_4_ + auVar75._0_4_;
          auVar191 = vmaxss_avx(ZEXT416((uint)fVar146),ZEXT416((uint)fVar166));
          auVar75 = vminss_avx(ZEXT416((uint)fVar193),ZEXT416((uint)fVar149));
          if (auVar75._0_4_ < auVar191._0_4_) goto LAB_00f171e2;
          auVar191 = vmovshdup_avx(auVar98);
          auVar136._0_4_ = auVar97._0_4_ * auVar191._0_4_;
          auVar136._4_4_ = auVar97._4_4_ * auVar191._4_4_;
          auVar136._8_4_ = auVar97._8_4_ * auVar191._8_4_;
          auVar136._12_4_ = auVar97._12_4_ * auVar191._12_4_;
          auVar102._0_4_ = auVar90._0_4_ * auVar191._0_4_;
          auVar102._4_4_ = auVar90._4_4_ * auVar191._4_4_;
          auVar102._8_4_ = auVar90._8_4_ * auVar191._8_4_;
          auVar102._12_4_ = auVar90._12_4_ * auVar191._12_4_;
          auVar75 = vminps_avx(auVar136,auVar102);
          auVar191 = vmaxps_avx(auVar102,auVar136);
          auVar97 = vmovshdup_avx(auVar199);
          auVar189._0_4_ = auVar97._0_4_ * auVar78._0_4_;
          auVar189._4_4_ = auVar97._4_4_ * auVar78._4_4_;
          auVar189._8_4_ = auVar97._8_4_ * auVar78._8_4_;
          auVar189._12_4_ = auVar97._12_4_ * auVar78._12_4_;
          auVar137._0_4_ = auVar97._0_4_ * auVar117._0_4_;
          auVar137._4_4_ = auVar97._4_4_ * auVar117._4_4_;
          auVar137._8_4_ = auVar97._8_4_ * auVar117._8_4_;
          auVar137._12_4_ = auVar97._12_4_ * auVar117._12_4_;
          auVar97 = vminps_avx(auVar189,auVar137);
          auVar203._0_4_ = auVar75._0_4_ + auVar97._0_4_;
          auVar203._4_4_ = auVar75._4_4_ + auVar97._4_4_;
          auVar203._8_4_ = auVar75._8_4_ + auVar97._8_4_;
          auVar203._12_4_ = auVar75._12_4_ + auVar97._12_4_;
          auVar75 = vmaxps_avx(auVar137,auVar189);
          auVar103._0_4_ = auVar191._0_4_ + auVar75._0_4_;
          auVar103._4_4_ = auVar191._4_4_ + auVar75._4_4_;
          auVar103._8_4_ = auVar191._8_4_ + auVar75._8_4_;
          auVar103._12_4_ = auVar191._12_4_ + auVar75._12_4_;
          auVar191 = vsubps_avx(auVar135,auVar103);
          auVar75 = vsubps_avx(auVar135,auVar203);
          auVar190._0_4_ = fVar171 * auVar191._0_4_;
          auVar190._4_4_ = fVar195 * auVar191._4_4_;
          auVar190._8_4_ = fVar128 * auVar191._8_4_;
          auVar190._12_4_ = fVar247 * auVar191._12_4_;
          auVar204._0_4_ = fVar171 * auVar75._0_4_;
          auVar204._4_4_ = fVar195 * auVar75._4_4_;
          auVar204._8_4_ = fVar128 * auVar75._8_4_;
          auVar204._12_4_ = fVar247 * auVar75._12_4_;
          auVar104._0_4_ = fVar147 * auVar191._0_4_;
          auVar104._4_4_ = fVar169 * auVar191._4_4_;
          auVar104._8_4_ = fVar194 * auVar191._8_4_;
          auVar104._12_4_ = fVar148 * auVar191._12_4_;
          auVar138._0_4_ = fVar147 * auVar75._0_4_;
          auVar138._4_4_ = fVar169 * auVar75._4_4_;
          auVar138._8_4_ = fVar194 * auVar75._8_4_;
          auVar138._12_4_ = fVar148 * auVar75._12_4_;
          auVar191 = vminps_avx(auVar190,auVar204);
          auVar75 = vminps_avx(auVar104,auVar138);
          auVar191 = vminps_avx(auVar191,auVar75);
          auVar75 = vmaxps_avx(auVar204,auVar190);
          auVar97 = vmaxps_avx(auVar138,auVar104);
          auVar191 = vhaddps_avx(auVar191,auVar191);
          auVar75 = vmaxps_avx(auVar97,auVar75);
          auVar75 = vhaddps_avx(auVar75,auVar75);
          auVar97 = vmovshdup_avx(auVar112);
          auVar90 = ZEXT416((uint)(auVar97._0_4_ + auVar191._0_4_));
          auVar191 = vmaxss_avx(local_6b0,auVar90);
          auVar97 = ZEXT416((uint)(auVar97._0_4_ + auVar75._0_4_));
          auVar75 = vminss_avx(auVar97,auVar89);
          auVar307._8_4_ = 0x7fffffff;
          auVar307._0_8_ = 0x7fffffff7fffffff;
          auVar307._12_4_ = 0x7fffffff;
          auVar309 = ZEXT1664(auVar307);
          if (auVar191._0_4_ <= auVar75._0_4_) {
            uVar71 = 0;
            if ((fVar146 < fVar166) && (uVar71 = 0, fVar193 < fVar149)) {
              auVar191 = vcmpps_avx(auVar97,auVar89,1);
              auVar75 = vcmpps_avx(local_6b0,auVar90,1);
              auVar191 = vandps_avx(auVar75,auVar191);
              uVar71 = auVar191._0_4_;
            }
            if (((uint)uVar72 < 4 && 0.001 <= fVar174) && (uVar71 & 1) == 0) {
              bVar50 = false;
            }
            else {
              lVar67 = 200;
              do {
                fVar166 = auVar112._0_4_;
                fVar174 = 1.0 - fVar166;
                auVar191 = ZEXT416((uint)(fVar174 * fVar174 * fVar174));
                auVar191 = vshufps_avx(auVar191,auVar191,0);
                auVar75 = ZEXT416((uint)(fVar166 * 3.0 * fVar174 * fVar174));
                auVar75 = vshufps_avx(auVar75,auVar75,0);
                auVar97 = ZEXT416((uint)(fVar174 * fVar166 * fVar166 * 3.0));
                auVar97 = vshufps_avx(auVar97,auVar97,0);
                auVar90 = ZEXT416((uint)(fVar166 * fVar166 * fVar166));
                auVar90 = vshufps_avx(auVar90,auVar90,0);
                fVar174 = local_690 * auVar191._0_4_ +
                          (float)local_620._0_4_ * auVar75._0_4_ +
                          (float)local_360._0_4_ * auVar90._0_4_ + local_560 * auVar97._0_4_;
                fVar166 = fStack_68c * auVar191._4_4_ +
                          (float)local_620._4_4_ * auVar75._4_4_ +
                          (float)local_360._4_4_ * auVar90._4_4_ + fStack_55c * auVar97._4_4_;
                auVar105._0_8_ = CONCAT44(fVar166,fVar174);
                auVar105._8_4_ =
                     fStack_688 * auVar191._8_4_ +
                     fStack_618 * auVar75._8_4_ +
                     fStack_358 * auVar90._8_4_ + fStack_558 * auVar97._8_4_;
                auVar105._12_4_ =
                     fStack_684 * auVar191._12_4_ +
                     fStack_614 * auVar75._12_4_ +
                     fStack_354 * auVar90._12_4_ + fStack_554 * auVar97._12_4_;
                auVar139._8_8_ = auVar105._0_8_;
                auVar139._0_8_ = auVar105._0_8_;
                auVar75 = vshufpd_avx(auVar105,auVar105,1);
                auVar191 = vmovshdup_avx(auVar112);
                auVar75 = vsubps_avx(auVar75,auVar139);
                auVar106._0_4_ = auVar191._0_4_ * auVar75._0_4_ + fVar174;
                auVar106._4_4_ = auVar191._4_4_ * auVar75._4_4_ + fVar166;
                auVar106._8_4_ = auVar191._8_4_ * auVar75._8_4_ + fVar174;
                auVar106._12_4_ = auVar191._12_4_ * auVar75._12_4_ + fVar166;
                auVar191 = vshufps_avx(auVar106,auVar106,0);
                auVar75 = vshufps_avx(auVar106,auVar106,0x55);
                auVar140._0_4_ = auVar98._0_4_ * auVar191._0_4_ + auVar199._0_4_ * auVar75._0_4_;
                auVar140._4_4_ = auVar98._4_4_ * auVar191._4_4_ + auVar199._4_4_ * auVar75._4_4_;
                auVar140._8_4_ = auVar98._8_4_ * auVar191._8_4_ + auVar199._8_4_ * auVar75._8_4_;
                auVar140._12_4_ =
                     auVar98._12_4_ * auVar191._12_4_ + auVar199._12_4_ * auVar75._12_4_;
                auVar112 = vsubps_avx(auVar112,auVar140);
                auVar191 = vandps_avx(auVar307,auVar106);
                auVar75 = vshufps_avx(auVar191,auVar191,0xf5);
                auVar191 = vmaxss_avx(auVar75,auVar191);
                if (auVar191._0_4_ < (float)local_370._0_4_) {
                  fVar174 = auVar112._0_4_;
                  if ((0.0 <= fVar174) && (fVar174 <= 1.0)) {
                    auVar98 = vmovshdup_avx(auVar112);
                    fVar166 = auVar98._0_4_;
                    if ((0.0 <= fVar166) && (fVar166 <= 1.0)) {
                      auVar98 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                              ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),
                                              0x1c);
                      auVar117 = vinsertps_avx(auVar98,ZEXT416((uint)pre->ray_space[k].vz.field_0.
                                                                     m128[2]),0x28);
                      auVar98 = vdpps_avx(auVar117,local_380,0x7f);
                      auVar199 = vdpps_avx(auVar117,local_390,0x7f);
                      auVar191 = vdpps_avx(auVar117,local_3c0,0x7f);
                      auVar75 = vdpps_avx(auVar117,local_3d0,0x7f);
                      auVar97 = vdpps_avx(auVar117,local_3e0,0x7f);
                      auVar90 = vdpps_avx(auVar117,local_3f0,0x7f);
                      fVar148 = 1.0 - fVar166;
                      auVar78 = vdpps_avx(auVar117,local_3a0,0x7f);
                      auVar117 = vdpps_avx(auVar117,local_3b0,0x7f);
                      fVar171 = 1.0 - fVar174;
                      fVar193 = auVar112._4_4_;
                      fVar147 = auVar112._8_4_;
                      fVar169 = auVar112._12_4_;
                      fVar194 = fVar171 * fVar174 * fVar174 * 3.0;
                      auVar192._0_4_ = fVar174 * fVar174 * fVar174;
                      auVar192._4_4_ = fVar193 * fVar193 * fVar193;
                      auVar192._8_4_ = fVar147 * fVar147 * fVar147;
                      auVar192._12_4_ = fVar169 * fVar169 * fVar169;
                      fVar193 = fVar174 * 3.0 * fVar171 * fVar171;
                      fVar147 = fVar171 * fVar171 * fVar171;
                      fVar174 = (fVar148 * auVar98._0_4_ + fVar166 * auVar191._0_4_) * fVar147 +
                                (fVar148 * auVar199._0_4_ + fVar166 * auVar75._0_4_) * fVar193 +
                                fVar194 * (fVar148 * auVar78._0_4_ + fVar166 * auVar97._0_4_) +
                                auVar192._0_4_ *
                                (auVar90._0_4_ * fVar166 + fVar148 * auVar117._0_4_);
                      if ((fVar129 <= fVar174) &&
                         (fVar166 = *(float *)(ray + k * 4 + 0x100), fVar174 <= fVar166)) {
                        pGVar6 = (context->scene->geometries).items[uVar65].ptr;
                        if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                          bVar74 = false;
                        }
                        else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                (bVar74 = true, pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)
                                ) {
                          local_f0 = vshufps_avx(auVar112,auVar112,0x55);
                          auVar228._8_4_ = 0x3f800000;
                          auVar228._0_8_ = &DAT_3f8000003f800000;
                          auVar228._12_4_ = 0x3f800000;
                          auVar98 = vsubps_avx(auVar228,local_f0);
                          fVar169 = local_f0._0_4_;
                          fVar148 = local_f0._4_4_;
                          fVar195 = local_f0._8_4_;
                          fVar128 = local_f0._12_4_;
                          fVar247 = auVar98._0_4_;
                          fVar248 = auVar98._4_4_;
                          fVar256 = auVar98._8_4_;
                          fVar150 = auVar98._12_4_;
                          auVar245._0_4_ =
                               fVar169 * (float)local_4c0._0_4_ + fVar247 * (float)local_4b0._0_4_;
                          auVar245._4_4_ =
                               fVar148 * (float)local_4c0._4_4_ + fVar248 * (float)local_4b0._4_4_;
                          auVar245._8_4_ = fVar195 * fStack_4b8 + fVar256 * fStack_4a8;
                          auVar245._12_4_ = fVar128 * fStack_4b4 + fVar150 * fStack_4a4;
                          auVar254._0_4_ =
                               fVar169 * (float)local_510._0_4_ + fVar247 * (float)local_4f0._0_4_;
                          auVar254._4_4_ =
                               fVar148 * (float)local_510._4_4_ + fVar248 * (float)local_4f0._4_4_;
                          auVar254._8_4_ = fVar195 * fStack_508 + fVar256 * fStack_4e8;
                          auVar254._12_4_ = fVar128 * fStack_504 + fVar150 * fStack_4e4;
                          auVar265._0_4_ =
                               fVar169 * (float)local_520._0_4_ + fVar247 * (float)local_500._0_4_;
                          auVar265._4_4_ =
                               fVar148 * (float)local_520._4_4_ + fVar248 * (float)local_500._4_4_;
                          auVar265._8_4_ = fVar195 * fStack_518 + fVar256 * fStack_4f8;
                          auVar265._12_4_ = fVar128 * fStack_514 + fVar150 * fStack_4f4;
                          auVar229._0_4_ =
                               fVar169 * (float)local_4e0._0_4_ + fVar247 * (float)local_4d0._0_4_;
                          auVar229._4_4_ =
                               fVar148 * (float)local_4e0._4_4_ + fVar248 * (float)local_4d0._4_4_;
                          auVar229._8_4_ = fVar195 * fStack_4d8 + fVar256 * fStack_4c8;
                          auVar229._12_4_ = fVar128 * fStack_4d4 + fVar150 * fStack_4c4;
                          auVar75 = vsubps_avx(auVar254,auVar245);
                          auVar97 = vsubps_avx(auVar265,auVar254);
                          auVar90 = vsubps_avx(auVar229,auVar265);
                          local_110 = vshufps_avx(auVar112,auVar112,0);
                          fVar169 = local_110._0_4_;
                          fVar195 = local_110._4_4_;
                          fVar128 = local_110._8_4_;
                          fVar248 = local_110._12_4_;
                          auVar98 = vshufps_avx(ZEXT416((uint)fVar171),ZEXT416((uint)fVar171),0);
                          fVar148 = auVar98._0_4_;
                          fVar171 = auVar98._4_4_;
                          fVar247 = auVar98._8_4_;
                          fVar256 = auVar98._12_4_;
                          auVar98 = vshufps_avx(auVar192,auVar192,0);
                          auVar199 = vshufps_avx(ZEXT416((uint)fVar194),ZEXT416((uint)fVar194),0);
                          auVar191 = vshufps_avx(ZEXT416((uint)fVar193),ZEXT416((uint)fVar193),0);
                          auVar162._0_4_ =
                               ((auVar97._0_4_ * fVar148 + auVar90._0_4_ * fVar169) * fVar169 +
                               (auVar75._0_4_ * fVar148 + auVar97._0_4_ * fVar169) * fVar148) * 3.0;
                          auVar162._4_4_ =
                               ((auVar97._4_4_ * fVar171 + auVar90._4_4_ * fVar195) * fVar195 +
                               (auVar75._4_4_ * fVar171 + auVar97._4_4_ * fVar195) * fVar171) * 3.0;
                          auVar162._8_4_ =
                               ((auVar97._8_4_ * fVar247 + auVar90._8_4_ * fVar128) * fVar128 +
                               (auVar75._8_4_ * fVar247 + auVar97._8_4_ * fVar128) * fVar247) * 3.0;
                          auVar162._12_4_ =
                               ((auVar97._12_4_ * fVar256 + auVar90._12_4_ * fVar248) * fVar248 +
                               (auVar75._12_4_ * fVar256 + auVar97._12_4_ * fVar248) * fVar256) *
                               3.0;
                          auVar75 = vshufps_avx(ZEXT416((uint)fVar147),ZEXT416((uint)fVar147),0);
                          auVar122._0_4_ =
                               auVar75._0_4_ * (float)local_420._0_4_ +
                               auVar191._0_4_ * (float)local_430._0_4_ +
                               auVar98._0_4_ * (float)local_450._0_4_ +
                               auVar199._0_4_ * (float)local_440._0_4_;
                          auVar122._4_4_ =
                               auVar75._4_4_ * (float)local_420._4_4_ +
                               auVar191._4_4_ * (float)local_430._4_4_ +
                               auVar98._4_4_ * (float)local_450._4_4_ +
                               auVar199._4_4_ * (float)local_440._4_4_;
                          auVar122._8_4_ =
                               auVar75._8_4_ * fStack_418 +
                               auVar191._8_4_ * fStack_428 +
                               auVar98._8_4_ * fStack_448 + auVar199._8_4_ * fStack_438;
                          auVar122._12_4_ =
                               auVar75._12_4_ * fStack_414 +
                               auVar191._12_4_ * fStack_424 +
                               auVar98._12_4_ * fStack_444 + auVar199._12_4_ * fStack_434;
                          auVar98 = vshufps_avx(auVar162,auVar162,0xc9);
                          auVar141._0_4_ = auVar122._0_4_ * auVar98._0_4_;
                          auVar141._4_4_ = auVar122._4_4_ * auVar98._4_4_;
                          auVar141._8_4_ = auVar122._8_4_ * auVar98._8_4_;
                          auVar141._12_4_ = auVar122._12_4_ * auVar98._12_4_;
                          auVar98 = vshufps_avx(auVar122,auVar122,0xc9);
                          auVar123._0_4_ = auVar162._0_4_ * auVar98._0_4_;
                          auVar123._4_4_ = auVar162._4_4_ * auVar98._4_4_;
                          auVar123._8_4_ = auVar162._8_4_ * auVar98._8_4_;
                          auVar123._12_4_ = auVar162._12_4_ * auVar98._12_4_;
                          auVar98 = vsubps_avx(auVar123,auVar141);
                          local_170 = vshufps_avx(auVar98,auVar98,0x55);
                          local_180[0] = (RTCHitN)local_170[0];
                          local_180[1] = (RTCHitN)local_170[1];
                          local_180[2] = (RTCHitN)local_170[2];
                          local_180[3] = (RTCHitN)local_170[3];
                          local_180[4] = (RTCHitN)local_170[4];
                          local_180[5] = (RTCHitN)local_170[5];
                          local_180[6] = (RTCHitN)local_170[6];
                          local_180[7] = (RTCHitN)local_170[7];
                          local_180[8] = (RTCHitN)local_170[8];
                          local_180[9] = (RTCHitN)local_170[9];
                          local_180[10] = (RTCHitN)local_170[10];
                          local_180[0xb] = (RTCHitN)local_170[0xb];
                          local_180[0xc] = (RTCHitN)local_170[0xc];
                          local_180[0xd] = (RTCHitN)local_170[0xd];
                          local_180[0xe] = (RTCHitN)local_170[0xe];
                          local_180[0xf] = (RTCHitN)local_170[0xf];
                          local_150 = vshufps_avx(auVar98,auVar98,0xaa);
                          local_160 = local_150;
                          local_130 = vshufps_avx(auVar98,auVar98,0);
                          local_140 = local_130;
                          local_120 = local_110;
                          local_100 = local_f0;
                          local_e0 = local_2e0._0_8_;
                          uStack_d8 = local_2e0._8_8_;
                          uStack_d0 = local_2e0._16_8_;
                          uStack_c8 = local_2e0._24_8_;
                          local_c0 = local_2c0._0_8_;
                          uStack_b8 = local_2c0._8_8_;
                          uStack_b0 = local_2c0._16_8_;
                          uStack_a8 = local_2c0._24_8_;
                          auVar81 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                          uStack_9c = context->user->instID[0];
                          local_a0 = uStack_9c;
                          uStack_98 = uStack_9c;
                          uStack_94 = uStack_9c;
                          uStack_90 = uStack_9c;
                          uStack_8c = uStack_9c;
                          uStack_84 = auVar81._28_4_;
                          uVar71 = uStack_84;
                          uStack_88 = uStack_9c;
                          uStack_84 = uStack_9c;
                          uStack_7c = context->user->instPrimID[0];
                          local_80 = uStack_7c;
                          uStack_78 = uStack_7c;
                          uStack_74 = uStack_7c;
                          uStack_70 = uStack_7c;
                          uStack_6c = uStack_7c;
                          uStack_68 = uStack_7c;
                          uStack_64 = uStack_7c;
                          *(float *)(ray + k * 4 + 0x100) = fVar174;
                          local_530 = *(undefined8 *)(mm_lookupmask_ps + lVar69);
                          uStack_528 = *(undefined8 *)(mm_lookupmask_ps + lVar69 + 8);
                          local_540 = *(undefined8 *)(mm_lookupmask_ps + uVar66);
                          uStack_538 = *(undefined8 *)(mm_lookupmask_ps + uVar66 + 8);
                          local_480.valid = (int *)&local_540;
                          local_480.geometryUserPtr = pGVar6->userPtr;
                          local_480.context = context->user;
                          local_480.ray = (RTCRayN *)ray;
                          local_480.hit = local_180;
                          local_480.N = 8;
                          if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar6->occlusionFilterN)(&local_480);
                            auVar309 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar60._8_8_ = uStack_538;
                          auVar60._0_8_ = local_540;
                          auVar98 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar60);
                          auVar62._8_8_ = uStack_528;
                          auVar62._0_8_ = local_530;
                          auVar199 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar62);
                          auVar85._16_16_ = auVar199;
                          auVar85._0_16_ = auVar98;
                          auVar18 = auVar81 & ~auVar85;
                          if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (auVar18 >> 0x3f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar18 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && SUB321(auVar18 >> 0x7f,0) == '\0') &&
                                (auVar18 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                               && SUB321(auVar18 >> 0xbf,0) == '\0') &&
                              (auVar18 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                              -1 < auVar18[0x1f]) {
                            auVar86._0_4_ = auVar98._0_4_ ^ auVar81._0_4_;
                            auVar86._4_4_ = auVar98._4_4_ ^ auVar81._4_4_;
                            auVar86._8_4_ = auVar98._8_4_ ^ auVar81._8_4_;
                            auVar86._12_4_ = auVar98._12_4_ ^ auVar81._12_4_;
                            auVar86._16_4_ = auVar199._0_4_ ^ auVar81._16_4_;
                            auVar86._20_4_ = auVar199._4_4_ ^ auVar81._20_4_;
                            auVar86._24_4_ = auVar199._8_4_ ^ auVar81._24_4_;
                            auVar86._28_4_ = auVar199._12_4_ ^ uVar71;
                          }
                          else {
                            p_Var7 = context->args->filter;
                            if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var7)(&local_480);
                              auVar309 = ZEXT1664(CONCAT412(0x7fffffff,
                                                            CONCAT48(0x7fffffff,0x7fffffff7fffffff))
                                                 );
                            }
                            auVar61._8_8_ = uStack_538;
                            auVar61._0_8_ = local_540;
                            auVar98 = vpcmpeqd_avx((undefined1  [16])0x0,auVar61);
                            auVar63._8_8_ = uStack_528;
                            auVar63._0_8_ = local_530;
                            auVar199 = vpcmpeqd_avx((undefined1  [16])0x0,auVar63);
                            auVar109._16_16_ = auVar199;
                            auVar109._0_16_ = auVar98;
                            auVar86._0_4_ = auVar98._0_4_ ^ auVar81._0_4_;
                            auVar86._4_4_ = auVar98._4_4_ ^ auVar81._4_4_;
                            auVar86._8_4_ = auVar98._8_4_ ^ auVar81._8_4_;
                            auVar86._12_4_ = auVar98._12_4_ ^ auVar81._12_4_;
                            auVar86._16_4_ = auVar199._0_4_ ^ auVar81._16_4_;
                            auVar86._20_4_ = auVar199._4_4_ ^ auVar81._20_4_;
                            auVar86._24_4_ = auVar199._8_4_ ^ auVar81._24_4_;
                            auVar86._28_4_ = auVar199._12_4_ ^ uVar71;
                            auVar127._8_4_ = 0xff800000;
                            auVar127._0_8_ = 0xff800000ff800000;
                            auVar127._12_4_ = 0xff800000;
                            auVar127._16_4_ = 0xff800000;
                            auVar127._20_4_ = 0xff800000;
                            auVar127._24_4_ = 0xff800000;
                            auVar127._28_4_ = 0xff800000;
                            auVar81 = vblendvps_avx(auVar127,*(undefined1 (*) [32])
                                                              (local_480.ray + 0x100),auVar109);
                            *(undefined1 (*) [32])(local_480.ray + 0x100) = auVar81;
                          }
                          bVar58 = (auVar86 >> 0x1f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar59 = (auVar86 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar57 = (auVar86 >> 0x5f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar56 = SUB321(auVar86 >> 0x7f,0) != '\0';
                          bVar55 = (auVar86 & (undefined1  [32])0x100000000) !=
                                   (undefined1  [32])0x0;
                          bVar52 = SUB321(auVar86 >> 0xbf,0) != '\0';
                          bVar51 = (auVar86 & (undefined1  [32])0x100000000) !=
                                   (undefined1  [32])0x0;
                          bVar74 = auVar86[0x1f] < '\0';
                          if (((((((!bVar58 && !bVar59) && !bVar57) && !bVar56) && !bVar55) &&
                               !bVar52) && !bVar51) && !bVar74) {
                            *(float *)(ray + k * 4 + 0x100) = fVar166;
                          }
                          bVar74 = ((((((bVar58 || bVar59) || bVar57) || bVar56) || bVar55) ||
                                    bVar52) || bVar51) || bVar74;
                        }
                        bVar64 = (bool)(bVar64 | bVar74);
                      }
                    }
                  }
                  break;
                }
                lVar67 = lVar67 + -1;
              } while (lVar67 != 0);
            }
            goto LAB_00f1720b;
          }
          goto LAB_00f171eb;
        }
        auVar309 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
      }
LAB_00f1720b:
    } while (bVar50);
    _local_640 = ZEXT416((uint)fVar146);
    local_400 = vinsertps_avx(_local_640,ZEXT416((uint)fVar149),0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }